

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  _func_int *p_Var8;
  long lVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int *piVar18;
  undefined1 auVar19 [16];
  void *pvVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  _func_int ***ppp_Var37;
  int iVar38;
  int iVar39;
  int iVar40;
  void *pvVar41;
  float *pfVar42;
  void *pvVar43;
  _func_int ***ppp_Var44;
  int iVar45;
  uint uVar46;
  float *pfVar47;
  uint uVar48;
  int iVar49;
  uint uVar50;
  float *pfVar51;
  uint uVar52;
  int iVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  uint uVar57;
  long lVar58;
  bool bVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar77;
  float fVar78;
  float sum [4];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar105 [28];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar136;
  float fVar140;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar134;
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 in_ZMM3 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar145;
  undefined1 in_ZMM4 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [16];
  undefined1 auVar161 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar162 [32];
  undefined1 auVar160 [16];
  undefined1 auVar163 [64];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar167 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  int elempack;
  int inh;
  ulong local_1f8;
  long local_1e0;
  long local_1d0;
  undefined1 (*local_1c8) [32];
  ulong local_1b8;
  void *local_1b0;
  ulong local_1a0;
  Allocator *local_198;
  Allocator *local_158;
  ulong local_148;
  ulong local_140;
  uint local_128;
  long local_120;
  undefined1 local_e8 [16];
  Mat local_d8;
  undefined8 local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  void *local_48;
  void *local_40;
  long local_38;
  undefined1 auVar113 [32];
  
  uVar29 = bottom_blob->elemsize;
  iVar4 = bottom_blob->elempack;
  p_Var8 = this->_vptr_Convolution1D_x86_avx[-3];
  iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var8);
  iVar6 = *(int *)(&this->field_0xd8 + (long)p_Var8);
  local_d8.cstep = 0;
  local_d8.data = (Allocator *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elempack = 0;
  local_d8.elemsize._4_4_ = (int)local_d8.refcount;
  local_d8.allocator = (Allocator *)local_d8.data;
  local_d8.dims = (int)local_d8.refcount;
  local_d8.w = local_d8.refcount._4_4_;
  local_d8.h = (int)local_d8.elemsize;
  local_d8.d = (int)local_d8.refcount;
  local_d8.c = local_d8.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)
             ((long)&this->_vptr_Convolution1D_x86_avx + (long)this->_vptr_Convolution1D_x86_avx[-3]
             ),bottom_blob,&local_d8,opt);
  iVar45 = -100;
  if (((Allocator *)local_d8.data != (Allocator *)0x0) && ((long)local_d8.c * local_d8.cstep != 0))
  {
    lVar26 = 1;
    if (opt->use_packing_layout == true) {
      lVar26 = 8;
      if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]) & 7) != 0) {
        lVar26 = (ulong)((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3])
                         & 3) == 0) * 3 + 1;
      }
    }
    Mat::create(top_blob,(local_d8.w + ~((iVar5 + -1) * iVar6)) /
                         *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx[-3]) +
                         1,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]) /
                (int)lVar26,lVar26 * (uVar29 / (ulong)(long)iVar4),(int)lVar26,opt->blob_allocator);
    iVar4 = local_d8.elempack;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var8 = this->_vptr_Convolution1D_x86_avx[-3];
      iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var8);
      uVar34 = *(uint *)(&this->field_0xf4 + (long)p_Var8);
      local_80 = (ulong)uVar34;
      iVar6 = *(int *)(&this->field_0xd8 + (long)p_Var8);
      lVar26 = (long)iVar6;
      iVar45 = *(int *)(&this->field_0xdc + (long)p_Var8);
      lVar27 = (long)iVar45;
      uVar21 = local_d8.h * local_d8.elempack;
      iVar22 = local_d8.w * local_d8.elempack;
      local_60 = (long)top_blob->w;
      local_88 = (long)top_blob->h * (long)top_blob->elempack;
      lVar54 = top_blob->elempack * local_60;
      iVar24 = (int)local_88;
      iVar25 = iVar24 + 7;
      if (-1 < iVar24) {
        iVar25 = iVar24;
      }
      lVar9 = *(long *)(&this->field_0x190 + (long)p_Var8);
      uVar48 = iVar25 >> 3;
      lVar56 = (long)iVar22;
      iVar25 = (int)lVar54;
      if (7 < iVar24) {
        local_90 = (ulong)(iVar25 * 7);
        auVar165 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar146 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar163 = ZEXT1664(ZEXT816(0) << 0x40);
        local_78 = lVar56 * 4;
        local_1f8 = 0;
        do {
          lVar28 = (long)top_blob->w;
          if (0 < lVar28) {
            uVar57 = local_d8.h * local_d8.elempack;
            iVar53 = top_blob->elempack;
            local_1c8 = (undefined1 (*) [32])
                        ((int)((long)((ulong)(uint)((int)(local_1f8 * 8) >> 0x1f) << 0x20 |
                                     local_1f8 * 8 & 0xffffffff) / (long)iVar53) * lVar28 *
                         top_blob->elemsize + (long)top_blob->data);
            local_1d0 = 0;
            iVar49 = 0;
            local_1e0 = 0;
            local_198 = (Allocator *)local_78;
            do {
              auVar150 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar169 = 0.0;
              fVar170 = 0.0;
              fVar166 = 0.0;
              fVar168 = 0.0;
              fVar171 = 0.0;
              fVar172 = 0.0;
              fVar173 = 0.0;
              fVar174 = 0.0;
              if (lVar9 != 0) {
                pfVar47 = (float *)(lVar9 + local_1f8 * 0x20);
                fVar166 = *pfVar47;
                fVar168 = pfVar47[1];
                fVar169 = pfVar47[2];
                fVar170 = pfVar47[3];
                fVar171 = pfVar47[4];
                fVar172 = pfVar47[5];
                fVar173 = pfVar47[6];
                fVar174 = pfVar47[7];
              }
              local_e8._0_4_ = iVar49;
              pfVar47 = (float *)((this->weight_data_tm).cstep * local_1f8 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              if ((int)uVar57 < 8) {
                fVar62 = 0.0;
                fVar77 = 0.0;
                fVar78 = 0.0;
                fVar79 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                fVar82 = 0.0;
                fVar83 = 0.0;
                fVar177 = 0.0;
                fVar178 = 0.0;
                fVar179 = 0.0;
                fVar180 = 0.0;
                fVar181 = 0.0;
                fVar182 = 0.0;
                fVar183 = 0.0;
                fVar184 = 0.0;
                uVar46 = 0;
              }
              else {
                fVar177 = 0.0;
                fVar178 = 0.0;
                fVar179 = 0.0;
                fVar180 = 0.0;
                fVar181 = 0.0;
                fVar182 = 0.0;
                fVar183 = 0.0;
                fVar184 = 0.0;
                fVar62 = 0.0;
                fVar77 = 0.0;
                fVar78 = 0.0;
                fVar79 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                fVar82 = 0.0;
                fVar83 = 0.0;
                iVar39 = 0;
                do {
                  lVar35 = (long)(iVar39 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  pfVar51 = (float *)((long)(_func_int ***)local_d8.data +
                                     lVar35 + (long)(iVar45 * local_d8.elempack * (int)local_1e0) *
                                              4);
                  if ((local_d8.elempack == 8) && (0 < iVar5)) {
                    pfVar51 = (float *)((long)(_func_int ***)local_d8.data +
                                       lVar35 + (long)iVar49 * 4);
                    iVar38 = iVar5;
                    do {
                      fVar145 = *pfVar51;
                      fVar1 = pfVar51[1];
                      fVar2 = pfVar51[2];
                      fVar140 = pfVar51[3];
                      fVar3 = pfVar51[4];
                      fVar115 = fVar140 * pfVar47[0x18] + auVar150._0_4_;
                      fVar134 = fVar140 * pfVar47[0x19] + auVar150._4_4_;
                      fVar135 = fVar140 * pfVar47[0x1a] + auVar150._8_4_;
                      fVar136 = fVar140 * pfVar47[0x1b] + auVar150._12_4_;
                      fVar137 = fVar140 * pfVar47[0x1c] + auVar150._16_4_;
                      fVar138 = fVar140 * pfVar47[0x1d] + auVar150._20_4_;
                      fVar139 = fVar140 * pfVar47[0x1e] + auVar150._24_4_;
                      fVar140 = fVar140 + auVar150._28_4_;
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar139,CONCAT420(fVar138,
                                                  CONCAT416(fVar137,CONCAT412(fVar136,CONCAT48(
                                                  fVar135,CONCAT44(fVar134,fVar115))))))));
                      fVar166 = fVar3 * pfVar47[0x20] + fVar166 + fVar145 * *pfVar47;
                      fVar168 = fVar3 * pfVar47[0x21] + fVar168 + fVar145 * pfVar47[1];
                      fVar169 = fVar3 * pfVar47[0x22] + fVar169 + fVar145 * pfVar47[2];
                      fVar170 = fVar3 * pfVar47[0x23] + fVar170 + fVar145 * pfVar47[3];
                      fVar171 = fVar3 * pfVar47[0x24] + fVar171 + fVar145 * pfVar47[4];
                      fVar172 = fVar3 * pfVar47[0x25] + fVar172 + fVar145 * pfVar47[5];
                      fVar173 = fVar3 * pfVar47[0x26] + fVar173 + fVar145 * pfVar47[6];
                      fVar174 = fVar3 + fVar174 + fVar145;
                      fVar145 = pfVar51[5];
                      fVar3 = pfVar51[6];
                      fVar177 = fVar1 * pfVar47[8] + fVar177 + fVar145 * pfVar47[0x28];
                      fVar178 = fVar1 * pfVar47[9] + fVar178 + fVar145 * pfVar47[0x29];
                      fVar179 = fVar1 * pfVar47[10] + fVar179 + fVar145 * pfVar47[0x2a];
                      fVar180 = fVar1 * pfVar47[0xb] + fVar180 + fVar145 * pfVar47[0x2b];
                      fVar181 = fVar1 * pfVar47[0xc] + fVar181 + fVar145 * pfVar47[0x2c];
                      fVar182 = fVar1 * pfVar47[0xd] + fVar182 + fVar145 * pfVar47[0x2d];
                      fVar183 = fVar1 * pfVar47[0xe] + fVar183 + fVar145 * pfVar47[0x2e];
                      fVar184 = fVar1 + fVar184 + fVar145;
                      fVar62 = fVar2 * pfVar47[0x10] + fVar62 + fVar3 * pfVar47[0x30];
                      fVar77 = fVar2 * pfVar47[0x11] + fVar77 + fVar3 * pfVar47[0x31];
                      fVar78 = fVar2 * pfVar47[0x12] + fVar78 + fVar3 * pfVar47[0x32];
                      fVar79 = fVar2 * pfVar47[0x13] + fVar79 + fVar3 * pfVar47[0x33];
                      fVar80 = fVar2 * pfVar47[0x14] + fVar80 + fVar3 * pfVar47[0x34];
                      fVar81 = fVar2 * pfVar47[0x15] + fVar81 + fVar3 * pfVar47[0x35];
                      fVar82 = fVar2 * pfVar47[0x16] + fVar82 + fVar3 * pfVar47[0x36];
                      fVar83 = fVar2 + fVar83 + fVar145;
                      fVar145 = pfVar51[7];
                      auVar150 = ZEXT3264(CONCAT428(fVar140 + fVar145,
                                                    CONCAT424(fVar139 + fVar145 * pfVar47[0x3e],
                                                              CONCAT420(fVar138 + fVar145 * pfVar47[
                                                  0x3d],CONCAT416(fVar137 + fVar145 * pfVar47[0x3c],
                                                                  CONCAT412(fVar136 + fVar145 * 
                                                  pfVar47[0x3b],
                                                  CONCAT48(fVar135 + fVar145 * pfVar47[0x3a],
                                                           CONCAT44(fVar134 + fVar145 * pfVar47[0x39
                                                  ],fVar115 + fVar145 * pfVar47[0x38]))))))));
                      pfVar47 = pfVar47 + 0x40;
                      pfVar51 = pfVar51 + iVar6 * 8;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((local_d8.elempack == 4) && (iVar38 = iVar5, 0 < iVar5)) {
                    do {
                      fVar145 = *pfVar51;
                      fVar1 = pfVar51[1];
                      fVar2 = pfVar51[2];
                      fVar177 = fVar177 + fVar1 * pfVar47[8];
                      fVar178 = fVar178 + fVar1 * pfVar47[9];
                      fVar179 = fVar179 + fVar1 * pfVar47[10];
                      fVar180 = fVar180 + fVar1 * pfVar47[0xb];
                      fVar181 = fVar181 + fVar1 * pfVar47[0xc];
                      fVar182 = fVar182 + fVar1 * pfVar47[0xd];
                      fVar183 = fVar183 + fVar1 * pfVar47[0xe];
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar184 + fVar1,
                                                   CONCAT424(fVar183,CONCAT420(fVar182,CONCAT416(
                                                  fVar181,CONCAT412(fVar180,CONCAT48(fVar179,
                                                  CONCAT44(fVar178,fVar177))))))));
                      fVar140 = pfVar51[3];
                      fVar3 = pfVar51[lVar56];
                      fVar166 = fVar3 * pfVar47[0x20] + fVar166 + fVar145 * *pfVar47;
                      fVar168 = fVar3 * pfVar47[0x21] + fVar168 + fVar145 * pfVar47[1];
                      fVar169 = fVar3 * pfVar47[0x22] + fVar169 + fVar145 * pfVar47[2];
                      fVar170 = fVar3 * pfVar47[0x23] + fVar170 + fVar145 * pfVar47[3];
                      fVar171 = fVar3 * pfVar47[0x24] + fVar171 + fVar145 * pfVar47[4];
                      fVar172 = fVar3 * pfVar47[0x25] + fVar172 + fVar145 * pfVar47[5];
                      fVar173 = fVar3 * pfVar47[0x26] + fVar173 + fVar145 * pfVar47[6];
                      fVar174 = fVar3 + fVar174 + fVar145;
                      fVar145 = pfVar51[lVar56 + 1];
                      fVar3 = pfVar51[lVar56 + 2];
                      fVar177 = fVar177 + fVar145 * pfVar47[0x28];
                      fVar178 = fVar178 + fVar145 * pfVar47[0x29];
                      fVar179 = fVar179 + fVar145 * pfVar47[0x2a];
                      fVar180 = fVar180 + fVar145 * pfVar47[0x2b];
                      fVar181 = fVar181 + fVar145 * pfVar47[0x2c];
                      fVar182 = fVar182 + fVar145 * pfVar47[0x2d];
                      fVar183 = fVar183 + fVar145 * pfVar47[0x2e];
                      fVar184 = fVar184 + fVar1 + fVar145;
                      fVar62 = fVar2 * pfVar47[0x10] + fVar62 + fVar3 * pfVar47[0x30];
                      fVar77 = fVar2 * pfVar47[0x11] + fVar77 + fVar3 * pfVar47[0x31];
                      fVar78 = fVar2 * pfVar47[0x12] + fVar78 + fVar3 * pfVar47[0x32];
                      fVar79 = fVar2 * pfVar47[0x13] + fVar79 + fVar3 * pfVar47[0x33];
                      fVar80 = fVar2 * pfVar47[0x14] + fVar80 + fVar3 * pfVar47[0x34];
                      fVar81 = fVar2 * pfVar47[0x15] + fVar81 + fVar3 * pfVar47[0x35];
                      fVar82 = fVar2 * pfVar47[0x16] + fVar82 + fVar3 * pfVar47[0x36];
                      fVar83 = fVar2 + fVar83 + fVar145;
                      fVar145 = pfVar51[lVar56 + 3];
                      auVar150 = ZEXT3264(CONCAT428(fVar140 + auVar150._28_4_ + fVar145,
                                                    CONCAT424(fVar140 * pfVar47[0x1e] +
                                                              auVar150._24_4_ +
                                                              fVar145 * pfVar47[0x3e],
                                                              CONCAT420(fVar140 * pfVar47[0x1d] +
                                                                        auVar150._20_4_ +
                                                                        fVar145 * pfVar47[0x3d],
                                                                        CONCAT416(fVar140 * pfVar47[
                                                  0x1c] + auVar150._16_4_ + fVar145 * pfVar47[0x3c],
                                                  CONCAT412(fVar140 * pfVar47[0x1b] +
                                                            auVar150._12_4_ +
                                                            fVar145 * pfVar47[0x3b],
                                                            CONCAT48(fVar140 * pfVar47[0x1a] +
                                                                     auVar150._8_4_ +
                                                                     fVar145 * pfVar47[0x3a],
                                                                     CONCAT44(fVar140 * pfVar47[0x19
                                                  ] + auVar150._4_4_ + fVar145 * pfVar47[0x39],
                                                  fVar140 * pfVar47[0x18] + auVar150._0_4_ +
                                                  fVar145 * pfVar47[0x38]))))))));
                      pfVar47 = pfVar47 + 0x40;
                      pfVar51 = pfVar51 + iVar6 * 4;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar38 = iVar5, 0 < iVar5)) {
                    do {
                      fVar145 = *pfVar51;
                      fVar1 = pfVar51[lVar56];
                      fVar2 = pfVar51[iVar22 * 2];
                      fVar177 = fVar177 + fVar1 * pfVar47[8];
                      fVar178 = fVar178 + fVar1 * pfVar47[9];
                      fVar179 = fVar179 + fVar1 * pfVar47[10];
                      fVar180 = fVar180 + fVar1 * pfVar47[0xb];
                      fVar181 = fVar181 + fVar1 * pfVar47[0xc];
                      fVar182 = fVar182 + fVar1 * pfVar47[0xd];
                      fVar183 = fVar183 + fVar1 * pfVar47[0xe];
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar184 + fVar1,
                                                   CONCAT424(fVar183,CONCAT420(fVar182,CONCAT416(
                                                  fVar181,CONCAT412(fVar180,CONCAT48(fVar179,
                                                  CONCAT44(fVar178,fVar177))))))));
                      fVar140 = pfVar51[iVar22 * 3];
                      fVar3 = pfVar51[iVar22 * 4];
                      fVar166 = fVar3 * pfVar47[0x20] + fVar166 + fVar145 * *pfVar47;
                      fVar168 = fVar3 * pfVar47[0x21] + fVar168 + fVar145 * pfVar47[1];
                      fVar169 = fVar3 * pfVar47[0x22] + fVar169 + fVar145 * pfVar47[2];
                      fVar170 = fVar3 * pfVar47[0x23] + fVar170 + fVar145 * pfVar47[3];
                      fVar171 = fVar3 * pfVar47[0x24] + fVar171 + fVar145 * pfVar47[4];
                      fVar172 = fVar3 * pfVar47[0x25] + fVar172 + fVar145 * pfVar47[5];
                      fVar173 = fVar3 * pfVar47[0x26] + fVar173 + fVar145 * pfVar47[6];
                      fVar174 = fVar3 + fVar174 + fVar145;
                      fVar145 = pfVar51[iVar22 * 5];
                      fVar3 = pfVar51[iVar22 * 6];
                      fVar177 = fVar177 + fVar145 * pfVar47[0x28];
                      fVar178 = fVar178 + fVar145 * pfVar47[0x29];
                      fVar179 = fVar179 + fVar145 * pfVar47[0x2a];
                      fVar180 = fVar180 + fVar145 * pfVar47[0x2b];
                      fVar181 = fVar181 + fVar145 * pfVar47[0x2c];
                      fVar182 = fVar182 + fVar145 * pfVar47[0x2d];
                      fVar183 = fVar183 + fVar145 * pfVar47[0x2e];
                      fVar184 = fVar184 + fVar1 + fVar145;
                      fVar62 = fVar2 * pfVar47[0x10] + fVar62 + fVar3 * pfVar47[0x30];
                      fVar77 = fVar2 * pfVar47[0x11] + fVar77 + fVar3 * pfVar47[0x31];
                      fVar78 = fVar2 * pfVar47[0x12] + fVar78 + fVar3 * pfVar47[0x32];
                      fVar79 = fVar2 * pfVar47[0x13] + fVar79 + fVar3 * pfVar47[0x33];
                      fVar80 = fVar2 * pfVar47[0x14] + fVar80 + fVar3 * pfVar47[0x34];
                      fVar81 = fVar2 * pfVar47[0x15] + fVar81 + fVar3 * pfVar47[0x35];
                      fVar82 = fVar2 * pfVar47[0x16] + fVar82 + fVar3 * pfVar47[0x36];
                      fVar83 = fVar2 + fVar83 + fVar145;
                      fVar145 = pfVar51[iVar22 * 7];
                      auVar150 = ZEXT3264(CONCAT428(fVar140 + auVar150._28_4_ + fVar145,
                                                    CONCAT424(fVar140 * pfVar47[0x1e] +
                                                              auVar150._24_4_ +
                                                              fVar145 * pfVar47[0x3e],
                                                              CONCAT420(fVar140 * pfVar47[0x1d] +
                                                                        auVar150._20_4_ +
                                                                        fVar145 * pfVar47[0x3d],
                                                                        CONCAT416(fVar140 * pfVar47[
                                                  0x1c] + auVar150._16_4_ + fVar145 * pfVar47[0x3c],
                                                  CONCAT412(fVar140 * pfVar47[0x1b] +
                                                            auVar150._12_4_ +
                                                            fVar145 * pfVar47[0x3b],
                                                            CONCAT48(fVar140 * pfVar47[0x1a] +
                                                                     auVar150._8_4_ +
                                                                     fVar145 * pfVar47[0x3a],
                                                                     CONCAT44(fVar140 * pfVar47[0x19
                                                  ] + auVar150._4_4_ + fVar145 * pfVar47[0x39],
                                                  fVar140 * pfVar47[0x18] + auVar150._0_4_ +
                                                  fVar145 * pfVar47[0x38]))))))));
                      pfVar47 = pfVar47 + 0x40;
                      pfVar51 = pfVar51 + lVar26;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  iVar38 = iVar39 + 0xf;
                  iVar39 = iVar39 + 8;
                  uVar46 = uVar57 & 0xfffffff8;
                } while (iVar38 < (int)uVar57);
              }
              auVar131 = auVar150._0_32_;
              if ((int)(uVar46 | 3) < (int)uVar57) {
                uVar52 = uVar46;
                do {
                  lVar35 = (long)((int)uVar52 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  pfVar51 = (float *)((long)(_func_int ***)local_d8.data +
                                     lVar35 + (long)(iVar45 * local_d8.elempack * (int)local_1e0) *
                                              4);
                  if ((local_d8.elempack == 4) && (0 < iVar5)) {
                    pfVar51 = (float *)((long)(_func_int ***)local_d8.data +
                                       lVar35 + (long)iVar49 * 4);
                    iVar39 = iVar5;
                    do {
                      fVar145 = *pfVar51;
                      fVar166 = fVar166 + fVar145 * *pfVar47;
                      fVar168 = fVar168 + fVar145 * pfVar47[1];
                      fVar169 = fVar169 + fVar145 * pfVar47[2];
                      fVar170 = fVar170 + fVar145 * pfVar47[3];
                      fVar171 = fVar171 + fVar145 * pfVar47[4];
                      fVar172 = fVar172 + fVar145 * pfVar47[5];
                      fVar173 = fVar173 + fVar145 * pfVar47[6];
                      fVar174 = fVar174 + fVar145;
                      fVar145 = pfVar51[1];
                      fVar1 = pfVar51[2];
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(
                                                  fVar1,CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(
                                                  fVar1,fVar1))))))));
                      fVar177 = fVar177 + fVar145 * pfVar47[8];
                      fVar178 = fVar178 + fVar145 * pfVar47[9];
                      fVar179 = fVar179 + fVar145 * pfVar47[10];
                      fVar180 = fVar180 + fVar145 * pfVar47[0xb];
                      fVar181 = fVar181 + fVar145 * pfVar47[0xc];
                      fVar182 = fVar182 + fVar145 * pfVar47[0xd];
                      fVar183 = fVar183 + fVar145 * pfVar47[0xe];
                      fVar184 = fVar184 + fVar145;
                      fVar62 = fVar1 * pfVar47[0x10] + fVar62;
                      fVar77 = fVar1 * pfVar47[0x11] + fVar77;
                      fVar78 = fVar1 * pfVar47[0x12] + fVar78;
                      fVar79 = fVar1 * pfVar47[0x13] + fVar79;
                      fVar80 = fVar1 * pfVar47[0x14] + fVar80;
                      fVar81 = fVar1 * pfVar47[0x15] + fVar81;
                      fVar82 = fVar1 * pfVar47[0x16] + fVar82;
                      fVar83 = fVar145 + fVar83;
                      fVar145 = pfVar51[3];
                      auVar150 = ZEXT3264(CONCAT428(fVar145 + auVar150._28_4_,
                                                    CONCAT424(fVar145 * pfVar47[0x1e] +
                                                              auVar150._24_4_,
                                                              CONCAT420(fVar145 * pfVar47[0x1d] +
                                                                        auVar150._20_4_,
                                                                        CONCAT416(fVar145 * pfVar47[
                                                  0x1c] + auVar150._16_4_,
                                                  CONCAT412(fVar145 * pfVar47[0x1b] +
                                                            auVar150._12_4_,
                                                            CONCAT48(fVar145 * pfVar47[0x1a] +
                                                                     auVar150._8_4_,
                                                                     CONCAT44(fVar145 * pfVar47[0x19
                                                  ] + auVar150._4_4_,
                                                  fVar145 * pfVar47[0x18] + auVar150._0_4_))))))));
                      pfVar47 = pfVar47 + 0x20;
                      pfVar51 = pfVar51 + iVar6 * 4;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar39 = iVar5, 0 < iVar5)) {
                    do {
                      fVar145 = *pfVar51;
                      fVar166 = fVar166 + fVar145 * *pfVar47;
                      fVar168 = fVar168 + fVar145 * pfVar47[1];
                      fVar169 = fVar169 + fVar145 * pfVar47[2];
                      fVar170 = fVar170 + fVar145 * pfVar47[3];
                      fVar171 = fVar171 + fVar145 * pfVar47[4];
                      fVar172 = fVar172 + fVar145 * pfVar47[5];
                      fVar173 = fVar173 + fVar145 * pfVar47[6];
                      fVar174 = fVar174 + fVar145;
                      fVar145 = pfVar51[lVar56];
                      fVar1 = pfVar51[iVar22 * 2];
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(
                                                  fVar1,CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(
                                                  fVar1,fVar1))))))));
                      fVar177 = fVar177 + fVar145 * pfVar47[8];
                      fVar178 = fVar178 + fVar145 * pfVar47[9];
                      fVar179 = fVar179 + fVar145 * pfVar47[10];
                      fVar180 = fVar180 + fVar145 * pfVar47[0xb];
                      fVar181 = fVar181 + fVar145 * pfVar47[0xc];
                      fVar182 = fVar182 + fVar145 * pfVar47[0xd];
                      fVar183 = fVar183 + fVar145 * pfVar47[0xe];
                      fVar184 = fVar184 + fVar145;
                      fVar62 = fVar1 * pfVar47[0x10] + fVar62;
                      fVar77 = fVar1 * pfVar47[0x11] + fVar77;
                      fVar78 = fVar1 * pfVar47[0x12] + fVar78;
                      fVar79 = fVar1 * pfVar47[0x13] + fVar79;
                      fVar80 = fVar1 * pfVar47[0x14] + fVar80;
                      fVar81 = fVar1 * pfVar47[0x15] + fVar81;
                      fVar82 = fVar1 * pfVar47[0x16] + fVar82;
                      fVar83 = fVar145 + fVar83;
                      fVar145 = pfVar51[iVar22 * 3];
                      auVar150 = ZEXT3264(CONCAT428(fVar145 + auVar150._28_4_,
                                                    CONCAT424(fVar145 * pfVar47[0x1e] +
                                                              auVar150._24_4_,
                                                              CONCAT420(fVar145 * pfVar47[0x1d] +
                                                                        auVar150._20_4_,
                                                                        CONCAT416(fVar145 * pfVar47[
                                                  0x1c] + auVar150._16_4_,
                                                  CONCAT412(fVar145 * pfVar47[0x1b] +
                                                            auVar150._12_4_,
                                                            CONCAT48(fVar145 * pfVar47[0x1a] +
                                                                     auVar150._8_4_,
                                                                     CONCAT44(fVar145 * pfVar47[0x19
                                                  ] + auVar150._4_4_,
                                                  fVar145 * pfVar47[0x18] + auVar150._0_4_))))))));
                      pfVar47 = pfVar47 + 0x20;
                      pfVar51 = pfVar51 + lVar26;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar131 = auVar150._0_32_;
                  uVar46 = uVar52 + 4;
                  iVar39 = uVar52 + 7;
                  uVar52 = uVar46;
                } while (iVar39 < (int)uVar57);
              }
              uVar29 = (ulong)uVar46;
              if ((int)(uVar46 | 1) < (int)uVar57) {
                lVar35 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                lVar36 = lVar35 * uVar29;
                lVar58 = (long)(_func_int ***)local_d8.data + lVar36 + (long)local_198;
                lVar35 = lVar35 * 2;
                lVar36 = (long)(_func_int ***)local_d8.data + lVar36 + local_1d0;
                do {
                  if (0 < iVar5) {
                    lVar55 = 0;
                    iVar39 = iVar5;
                    do {
                      fVar145 = *(float *)(lVar36 + lVar55);
                      fVar166 = fVar166 + fVar145 * *pfVar47;
                      fVar168 = fVar168 + fVar145 * pfVar47[1];
                      fVar169 = fVar169 + fVar145 * pfVar47[2];
                      fVar170 = fVar170 + fVar145 * pfVar47[3];
                      fVar171 = fVar171 + fVar145 * pfVar47[4];
                      fVar172 = fVar172 + fVar145 * pfVar47[5];
                      fVar173 = fVar173 + fVar145 * pfVar47[6];
                      fVar174 = fVar174 + fVar145;
                      fVar145 = *(float *)(lVar58 + lVar55);
                      fVar177 = fVar177 + fVar145 * pfVar47[8];
                      fVar178 = fVar178 + fVar145 * pfVar47[9];
                      fVar179 = fVar179 + fVar145 * pfVar47[10];
                      fVar180 = fVar180 + fVar145 * pfVar47[0xb];
                      fVar181 = fVar181 + fVar145 * pfVar47[0xc];
                      fVar182 = fVar182 + fVar145 * pfVar47[0xd];
                      fVar183 = fVar183 + fVar145 * pfVar47[0xe];
                      fVar184 = fVar184 + fVar145;
                      pfVar47 = pfVar47 + 0x10;
                      lVar55 = lVar55 + lVar26 * 4;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar29 = uVar29 + 2;
                  uVar46 = (uint)uVar29;
                  lVar58 = lVar58 + lVar35;
                  lVar36 = lVar36 + lVar35;
                } while ((int)(uVar46 | 1) < (int)uVar57);
              }
              if ((int)uVar46 < (int)uVar57) {
                lVar35 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                uVar29 = (ulong)uVar46;
                pfVar51 = (float *)((long)(_func_int ***)local_d8.data + lVar35 * uVar29 + local_1d0
                                   );
                do {
                  pfVar32 = pfVar51;
                  iVar39 = iVar5;
                  if (0 < iVar5) {
                    do {
                      fVar145 = *pfVar32;
                      fVar166 = fVar166 + fVar145 * *pfVar47;
                      fVar168 = fVar168 + fVar145 * pfVar47[1];
                      fVar169 = fVar169 + fVar145 * pfVar47[2];
                      fVar170 = fVar170 + fVar145 * pfVar47[3];
                      fVar171 = fVar171 + fVar145 * pfVar47[4];
                      fVar172 = fVar172 + fVar145 * pfVar47[5];
                      fVar173 = fVar173 + fVar145 * pfVar47[6];
                      fVar174 = fVar174 + fVar145;
                      pfVar47 = pfVar47 + 8;
                      pfVar32 = pfVar32 + lVar26;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar29 = uVar29 + 1;
                  pfVar51 = (float *)((long)pfVar51 + lVar35);
                } while ((int)uVar29 < (int)uVar57);
              }
              fVar62 = fVar62 + auVar131._0_4_ + fVar177 + fVar166;
              fVar77 = fVar77 + auVar131._4_4_ + fVar178 + fVar168;
              auVar74._0_8_ = CONCAT44(fVar77,fVar62);
              auVar74._8_4_ = fVar78 + auVar131._8_4_ + fVar179 + fVar169;
              auVar74._12_4_ = fVar79 + auVar131._12_4_ + fVar180 + fVar170;
              auVar74._16_4_ = fVar80 + auVar131._16_4_ + fVar181 + fVar171;
              auVar74._20_4_ = fVar81 + auVar131._20_4_ + fVar182 + fVar172;
              auVar74._24_4_ = fVar82 + auVar131._24_4_ + fVar183 + fVar173;
              auVar74._28_4_ = fVar83 + auVar131._28_4_ + fVar184 + fVar174;
              auVar161 = auVar163._0_32_;
              fVar78 = auVar165._0_4_;
              fVar79 = auVar165._4_4_;
              fVar80 = auVar165._8_4_;
              fVar81 = auVar165._12_4_;
              fVar82 = auVar165._16_4_;
              fVar83 = auVar165._20_4_;
              fVar177 = auVar165._24_4_;
              fVar178 = auVar165._28_4_;
              auVar131 = auVar146._0_32_;
              fVar166 = auVar146._0_4_;
              fVar168 = auVar146._4_4_;
              fVar169 = auVar146._8_4_;
              fVar170 = auVar146._12_4_;
              fVar171 = auVar146._16_4_;
              fVar172 = auVar146._20_4_;
              fVar173 = auVar146._24_4_;
              fVar174 = auVar146._28_4_;
              switch(uVar34) {
              case 1:
                auVar74 = vmaxps_avx(auVar161,auVar74);
                break;
              case 2:
                auVar131 = vmaxps_avx(auVar161,auVar74);
                auVar161 = vminps_avx(auVar161,auVar74);
                fVar166 = **(float **)(&this->field_0xf8 + (long)p_Var8);
                in_ZMM3 = ZEXT3264(CONCAT428(fVar166,CONCAT424(fVar166,CONCAT420(fVar166,CONCAT416(
                                                  fVar166,CONCAT412(fVar166,CONCAT48(fVar166,
                                                  CONCAT44(fVar166,fVar166))))))));
                auVar74._0_4_ = fVar166 * auVar161._0_4_ + auVar131._0_4_;
                auVar74._4_4_ = fVar166 * auVar161._4_4_ + auVar131._4_4_;
                auVar74._8_4_ = fVar166 * auVar161._8_4_ + auVar131._8_4_;
                auVar74._12_4_ = fVar166 * auVar161._12_4_ + auVar131._12_4_;
                auVar74._16_4_ = fVar166 * auVar161._16_4_ + auVar131._16_4_;
                auVar74._20_4_ = fVar166 * auVar161._20_4_ + auVar131._20_4_;
                auVar74._24_4_ = fVar166 * auVar161._24_4_ + auVar131._24_4_;
                auVar74._28_4_ = auVar161._28_4_ + auVar131._28_4_;
                break;
              case 3:
                uVar7 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var8);
                auVar109._4_4_ = uVar7;
                auVar109._0_4_ = uVar7;
                auVar109._8_4_ = uVar7;
                auVar109._12_4_ = uVar7;
                auVar109._16_4_ = uVar7;
                auVar109._20_4_ = uVar7;
                auVar109._24_4_ = uVar7;
                auVar109._28_4_ = uVar7;
                uVar7 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var8))[1];
                auVar133._4_4_ = uVar7;
                auVar133._0_4_ = uVar7;
                auVar133._8_4_ = uVar7;
                auVar133._12_4_ = uVar7;
                auVar133._16_4_ = uVar7;
                auVar133._20_4_ = uVar7;
                auVar133._24_4_ = uVar7;
                auVar133._28_4_ = uVar7;
                in_ZMM3 = ZEXT3264(auVar133);
                auVar131 = vmaxps_avx(auVar74,auVar109);
                auVar74 = vminps_avx(auVar131,auVar133);
                break;
              case 4:
                auVar75._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
                auVar75._8_4_ = -auVar74._8_4_;
                auVar75._12_4_ = -auVar74._12_4_;
                auVar75._16_4_ = -auVar74._16_4_;
                auVar75._20_4_ = -auVar74._20_4_;
                auVar75._24_4_ = -auVar74._24_4_;
                auVar75._28_4_ = -auVar74._28_4_;
                auVar110._8_4_ = 0x42b0c0a5;
                auVar110._0_8_ = 0x42b0c0a542b0c0a5;
                auVar110._12_4_ = 0x42b0c0a5;
                auVar110._16_4_ = 0x42b0c0a5;
                auVar110._20_4_ = 0x42b0c0a5;
                auVar110._24_4_ = 0x42b0c0a5;
                auVar110._28_4_ = 0x42b0c0a5;
                auVar74 = vminps_avx(auVar75,auVar110);
                auVar111._8_4_ = 0xc2b0c0a5;
                auVar111._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar111._12_4_ = 0xc2b0c0a5;
                auVar111._16_4_ = 0xc2b0c0a5;
                auVar111._20_4_ = 0xc2b0c0a5;
                auVar111._24_4_ = 0xc2b0c0a5;
                auVar111._28_4_ = 0xc2b0c0a5;
                auVar161 = vmaxps_avx(auVar74,auVar111);
                auVar112._0_4_ = fVar78 + auVar161._0_4_ * 1.442695;
                auVar112._4_4_ = fVar79 + auVar161._4_4_ * 1.442695;
                auVar112._8_4_ = fVar80 + auVar161._8_4_ * 1.442695;
                auVar112._12_4_ = fVar81 + auVar161._12_4_ * 1.442695;
                auVar112._16_4_ = fVar82 + auVar161._16_4_ * 1.442695;
                auVar112._20_4_ = fVar83 + auVar161._20_4_ * 1.442695;
                auVar112._24_4_ = fVar177 + auVar161._24_4_ * 1.442695;
                auVar112._28_4_ = fVar178 + 1.442695;
                auVar114 = vroundps_avx(auVar112,1);
                auVar74 = vcmpps_avx(auVar112,auVar114,1);
                auVar74 = vandps_avx(auVar74,auVar131);
                auVar74 = vsubps_avx(auVar114,auVar74);
                fVar62 = auVar161._0_4_ + auVar74._0_4_ * -0.6931472;
                fVar77 = auVar161._4_4_ + auVar74._4_4_ * -0.6931472;
                fVar178 = auVar161._8_4_ + auVar74._8_4_ * -0.6931472;
                fVar179 = auVar161._12_4_ + auVar74._12_4_ * -0.6931472;
                fVar180 = auVar161._16_4_ + auVar74._16_4_ * -0.6931472;
                fVar181 = auVar161._20_4_ + auVar74._20_4_ * -0.6931472;
                fVar182 = auVar161._24_4_ + auVar74._24_4_ * -0.6931472;
                auVar84._0_4_ = (int)auVar74._0_4_;
                auVar84._4_4_ = (int)auVar74._4_4_;
                auVar84._8_4_ = (int)auVar74._8_4_;
                auVar84._12_4_ = (int)auVar74._12_4_;
                auVar113._16_4_ = (int)auVar74._16_4_;
                auVar113._0_16_ = auVar84;
                auVar113._20_4_ = (int)auVar74._20_4_;
                auVar113._24_4_ = (int)auVar74._24_4_;
                auVar113._28_4_ = (int)auVar74._28_4_;
                auVar147 = vpslld_avx(auVar84,0x17);
                auVar116 = vpslld_avx(auVar113._16_16_,0x17);
                auVar60._8_4_ = 0x3f800000;
                auVar60._0_8_ = 0x3f8000003f800000;
                auVar60._12_4_ = 0x3f800000;
                auVar116 = vpaddd_avx(auVar116,auVar60);
                auVar147 = vpaddd_avx(auVar147,auVar60);
                in_ZMM3 = ZEXT1664(auVar147);
                auVar76._0_4_ =
                     (fVar62 + fVar166 +
                     fVar62 * fVar62 *
                     (fVar78 + ((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) *
                                 fVar62 + 0.041665796) * fVar62 + 0.16666666) * fVar62)) *
                     auVar147._0_4_ + fVar166;
                auVar76._4_4_ =
                     (fVar77 + fVar168 +
                     fVar77 * fVar77 *
                     (fVar79 + ((((fVar77 * 0.00019875691 + 0.0013981999) * fVar77 + 0.008333452) *
                                 fVar77 + 0.041665796) * fVar77 + 0.16666666) * fVar77)) *
                     auVar147._4_4_ + fVar168;
                auVar76._8_4_ =
                     (fVar178 + fVar169 +
                     fVar178 * fVar178 *
                     (fVar80 + ((((fVar178 * 0.00019875691 + 0.0013981999) * fVar178 + 0.008333452)
                                 * fVar178 + 0.041665796) * fVar178 + 0.16666666) * fVar178)) *
                     auVar147._8_4_ + fVar169;
                auVar76._12_4_ =
                     (fVar179 + fVar170 +
                     fVar179 * fVar179 *
                     (fVar81 + ((((fVar179 * 0.00019875691 + 0.0013981999) * fVar179 + 0.008333452)
                                 * fVar179 + 0.041665796) * fVar179 + 0.16666666) * fVar179)) *
                     auVar147._12_4_ + fVar170;
                auVar76._16_4_ =
                     (fVar180 + fVar171 +
                     fVar180 * fVar180 *
                     (fVar82 + ((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452)
                                 * fVar180 + 0.041665796) * fVar180 + 0.16666666) * fVar180)) *
                     auVar116._0_4_ + fVar171;
                auVar76._20_4_ =
                     (fVar181 + fVar172 +
                     fVar181 * fVar181 *
                     (fVar83 + ((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452)
                                 * fVar181 + 0.041665796) * fVar181 + 0.16666666) * fVar181)) *
                     auVar116._4_4_ + fVar172;
                auVar76._24_4_ =
                     (fVar182 + fVar173 +
                     fVar182 * fVar182 *
                     (fVar177 +
                     ((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182
                      + 0.041665796) * fVar182 + 0.16666666) * fVar182)) * auVar116._8_4_ + fVar173;
                auVar76._28_4_ = auVar161._28_4_ + -0.6931472 + fVar174 + -0.6931472 + fVar174;
                auVar161 = vrcpps_avx(auVar76);
                fVar166 = auVar161._0_4_;
                fVar168 = auVar161._4_4_;
                auVar17._4_4_ = auVar76._4_4_ * fVar168;
                auVar17._0_4_ = auVar76._0_4_ * fVar166;
                fVar169 = auVar161._8_4_;
                auVar17._8_4_ = auVar76._8_4_ * fVar169;
                fVar170 = auVar161._12_4_;
                auVar17._12_4_ = auVar76._12_4_ * fVar170;
                fVar171 = auVar161._16_4_;
                auVar17._16_4_ = auVar76._16_4_ * fVar171;
                fVar172 = auVar161._20_4_;
                auVar17._20_4_ = auVar76._20_4_ * fVar172;
                fVar173 = auVar161._24_4_;
                auVar17._24_4_ = auVar76._24_4_ * fVar173;
                auVar17._28_4_ = auVar76._28_4_;
                auVar131 = vsubps_avx(auVar131,auVar17);
                auVar74._0_4_ = fVar166 + fVar166 * auVar131._0_4_;
                auVar74._4_4_ = fVar168 + fVar168 * auVar131._4_4_;
                auVar74._8_4_ = fVar169 + fVar169 * auVar131._8_4_;
                auVar74._12_4_ = fVar170 + fVar170 * auVar131._12_4_;
                auVar74._16_4_ = fVar171 + fVar171 * auVar131._16_4_;
                auVar74._20_4_ = fVar172 + fVar172 * auVar131._20_4_;
                auVar74._24_4_ = fVar173 + fVar173 * auVar131._24_4_;
                auVar74._28_4_ = auVar161._28_4_ + auVar131._28_4_;
                break;
              case 5:
                auVar162._8_4_ = 0x42b0c0a5;
                auVar162._0_8_ = 0x42b0c0a542b0c0a5;
                auVar162._12_4_ = 0x42b0c0a5;
                auVar162._16_4_ = 0x42b0c0a5;
                auVar162._20_4_ = 0x42b0c0a5;
                auVar162._24_4_ = 0x42b0c0a5;
                auVar162._28_4_ = 0x42b0c0a5;
                auVar161 = vminps_avx(auVar162,auVar74);
                auVar164._8_4_ = 0xc2b0c0a5;
                auVar164._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar164._12_4_ = 0xc2b0c0a5;
                auVar164._16_4_ = 0xc2b0c0a5;
                auVar164._20_4_ = 0xc2b0c0a5;
                auVar164._24_4_ = 0xc2b0c0a5;
                auVar164._28_4_ = 0xc2b0c0a5;
                auVar114 = vmaxps_avx(auVar164,auVar161);
                auVar126._0_4_ = fVar78 + auVar114._0_4_ * 1.442695;
                auVar126._4_4_ = fVar79 + auVar114._4_4_ * 1.442695;
                auVar126._8_4_ = fVar80 + auVar114._8_4_ * 1.442695;
                auVar126._12_4_ = fVar81 + auVar114._12_4_ * 1.442695;
                auVar126._16_4_ = fVar82 + auVar114._16_4_ * 1.442695;
                auVar126._20_4_ = fVar83 + auVar114._20_4_ * 1.442695;
                auVar126._24_4_ = fVar177 + auVar114._24_4_ * 1.442695;
                auVar126._28_4_ = fVar178 + in_ZMM3._28_4_;
                auVar132 = vroundps_avx(auVar126,1);
                auVar161 = vcmpps_avx(auVar126,auVar132,1);
                auVar161 = vandps_avx(auVar161,auVar131);
                auVar161 = vsubps_avx(auVar132,auVar161);
                auVar14._4_4_ = auVar161._4_4_ * 0.6931472;
                auVar14._0_4_ = auVar161._0_4_ * 0.6931472;
                auVar14._8_4_ = auVar161._8_4_ * 0.6931472;
                auVar14._12_4_ = auVar161._12_4_ * 0.6931472;
                auVar14._16_4_ = auVar161._16_4_ * 0.6931472;
                auVar14._20_4_ = auVar161._20_4_ * 0.6931472;
                auVar14._24_4_ = auVar161._24_4_ * 0.6931472;
                auVar14._28_4_ = auVar132._28_4_;
                auVar114 = vsubps_avx(auVar114,auVar14);
                fVar179 = auVar114._0_4_;
                fVar180 = auVar114._4_4_;
                fVar181 = auVar114._8_4_;
                fVar182 = auVar114._12_4_;
                fVar183 = auVar114._16_4_;
                fVar184 = auVar114._20_4_;
                fVar145 = auVar114._24_4_;
                auVar116._0_4_ = (int)auVar161._0_4_;
                auVar116._4_4_ = (int)auVar161._4_4_;
                auVar116._8_4_ = (int)auVar161._8_4_;
                auVar116._12_4_ = (int)auVar161._12_4_;
                auVar127._16_4_ = (int)auVar161._16_4_;
                auVar127._0_16_ = auVar116;
                auVar127._20_4_ = (int)auVar161._20_4_;
                auVar127._24_4_ = (int)auVar161._24_4_;
                auVar127._28_4_ = (int)auVar161._28_4_;
                auVar147 = vpslld_avx(auVar116,0x17);
                auVar116 = vpslld_avx(auVar127._16_16_,0x17);
                auVar141._8_4_ = 0x3f800000;
                auVar141._0_8_ = 0x3f8000003f800000;
                auVar141._12_4_ = 0x3f800000;
                in_ZMM4 = ZEXT1664(auVar141);
                auVar116 = vpaddd_avx(auVar116,auVar141);
                auVar147 = vpaddd_avx(auVar147,auVar141);
                auVar149._0_4_ =
                     (fVar179 + fVar166 +
                     fVar179 * fVar179 *
                     (((((fVar179 * 0.00019875691 + 0.0013981999) * fVar179 + 0.008333452) * fVar179
                       + 0.041665796) * fVar179 + 0.16666666) * fVar179 + fVar78)) * auVar147._0_4_
                     + fVar166;
                auVar149._4_4_ =
                     (fVar180 + fVar168 +
                     fVar180 * fVar180 *
                     (((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452) * fVar180
                       + 0.041665796) * fVar180 + 0.16666666) * fVar180 + fVar79)) * auVar147._4_4_
                     + fVar168;
                auVar149._8_4_ =
                     (fVar181 + fVar169 +
                     fVar181 * fVar181 *
                     (((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452) * fVar181
                       + 0.041665796) * fVar181 + 0.16666666) * fVar181 + fVar80)) * auVar147._8_4_
                     + fVar169;
                auVar149._12_4_ =
                     (fVar182 + fVar170 +
                     fVar182 * fVar182 *
                     (((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182
                       + 0.041665796) * fVar182 + 0.16666666) * fVar182 + fVar81)) * auVar147._12_4_
                     + fVar170;
                auVar149._16_4_ =
                     (fVar183 + fVar171 +
                     fVar183 * fVar183 *
                     (((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452) * fVar183
                       + 0.041665796) * fVar183 + 0.16666666) * fVar183 + fVar82)) * auVar116._0_4_
                     + fVar171;
                auVar149._20_4_ =
                     (fVar184 + fVar172 +
                     fVar184 * fVar184 *
                     (((((fVar184 * 0.00019875691 + 0.0013981999) * fVar184 + 0.008333452) * fVar184
                       + 0.041665796) * fVar184 + 0.16666666) * fVar184 + fVar83)) * auVar116._4_4_
                     + fVar172;
                auVar149._24_4_ =
                     (fVar145 + fVar173 +
                     fVar145 * fVar145 *
                     (((((fVar145 * 0.00019875691 + 0.0013981999) * fVar145 + 0.008333452) * fVar145
                       + 0.041665796) * fVar145 + 0.16666666) * fVar145 + fVar177)) * auVar116._8_4_
                     + fVar173;
                auVar149._28_4_ = auVar114._28_4_ + fVar174 + auVar132._28_4_ + fVar174;
                auVar106._8_4_ = 0x800000;
                auVar106._0_8_ = 0x80000000800000;
                auVar106._12_4_ = 0x800000;
                auVar106._16_4_ = 0x800000;
                auVar106._20_4_ = 0x800000;
                auVar106._24_4_ = 0x800000;
                auVar106._28_4_ = 0x800000;
                auVar132 = vmaxps_avx(auVar149,auVar106);
                auVar116 = vpsrld_avx(auVar132._16_16_,0x17);
                auVar159._8_4_ = 0x807fffff;
                auVar159._0_8_ = 0x807fffff807fffff;
                auVar159._12_4_ = 0x807fffff;
                auVar159._16_4_ = 0x807fffff;
                auVar159._20_4_ = 0x807fffff;
                auVar159._24_4_ = 0x807fffff;
                auVar159._28_4_ = 0x807fffff;
                auVar161 = vandps_avx(auVar132,auVar159);
                auVar14 = vorps_avx(auVar161,auVar165._0_32_);
                auVar167._8_4_ = 0x3f3504f3;
                auVar167._0_8_ = 0x3f3504f33f3504f3;
                auVar167._12_4_ = 0x3f3504f3;
                auVar167._16_4_ = 0x3f3504f3;
                auVar167._20_4_ = 0x3f3504f3;
                auVar167._24_4_ = 0x3f3504f3;
                auVar167._28_4_ = 0x3f3504f3;
                auVar114 = vcmpps_avx(auVar167,auVar14,2);
                auVar161 = vandnps_avx(auVar114,auVar14);
                fVar179 = auVar161._0_4_ + auVar14._0_4_ + -1.0;
                fVar180 = auVar161._4_4_ + auVar14._4_4_ + -1.0;
                fVar181 = auVar161._8_4_ + auVar14._8_4_ + -1.0;
                fVar182 = auVar161._12_4_ + auVar14._12_4_ + -1.0;
                fVar183 = auVar161._16_4_ + auVar14._16_4_ + -1.0;
                fVar184 = auVar161._20_4_ + auVar14._20_4_ + -1.0;
                fVar145 = auVar161._24_4_ + auVar14._24_4_ + -1.0;
                auVar116 = vpsubd_avx(auVar116,auVar114._16_16_);
                auVar147 = vpsrld_avx(auVar132._0_16_,0x17);
                auVar151._8_4_ = 0xffffff81;
                auVar151._0_8_ = 0xffffff81ffffff81;
                auVar151._12_4_ = 0xffffff81;
                auVar116 = vpaddd_avx(auVar116,auVar151);
                auVar147 = vpsubd_avx(auVar147,auVar114._0_16_);
                auVar147 = vpaddd_avx(auVar147,auVar151);
                auVar107._16_16_ = auVar116;
                auVar107._0_16_ = auVar147;
                auVar114 = vcmpps_avx(auVar149,_DAT_0059a1e0,2);
                auVar132 = vcvtdq2ps_avx(auVar107);
                auVar15._4_4_ =
                     (fVar180 + auVar132._4_4_ * 0.6931472 +
                     fVar180 * fVar180 *
                     (fVar180 * (fVar180 * (fVar180 * (fVar180 * (fVar180 * (fVar180 * (fVar180 * (
                                                  fVar180 * (fVar180 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._0_4_ =
                     (fVar179 + auVar132._0_4_ * 0.6931472 +
                     fVar179 * fVar179 *
                     (fVar179 * (fVar179 * (fVar179 * (fVar179 * (fVar179 * (fVar179 * (fVar179 * (
                                                  fVar179 * (fVar179 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._8_4_ =
                     (fVar181 + auVar132._8_4_ * 0.6931472 +
                     fVar181 * fVar181 *
                     (fVar181 * (fVar181 * (fVar181 * (fVar181 * (fVar181 * (fVar181 * (fVar181 * (
                                                  fVar181 * (fVar181 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._12_4_ =
                     (fVar182 + auVar132._12_4_ * 0.6931472 +
                     fVar182 * fVar182 *
                     (fVar182 * (fVar182 * (fVar182 * (fVar182 * (fVar182 * (fVar182 * (fVar182 * (
                                                  fVar182 * (fVar182 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._16_4_ =
                     (fVar183 + auVar132._16_4_ * 0.6931472 +
                     fVar183 * fVar183 *
                     (fVar183 * (fVar183 * (fVar183 * (fVar183 * (fVar183 * (fVar183 * (fVar183 * (
                                                  fVar183 * (fVar183 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._20_4_ =
                     (fVar184 + auVar132._20_4_ * 0.6931472 +
                     fVar184 * fVar184 *
                     (fVar184 * (fVar184 * (fVar184 * (fVar184 * (fVar184 * (fVar184 * (fVar184 * (
                                                  fVar184 * (fVar184 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._24_4_ =
                     (fVar145 + auVar132._24_4_ * 0.6931472 +
                     fVar145 * fVar145 *
                     (fVar145 * (fVar145 * (fVar145 * (fVar145 * (fVar145 * (fVar145 * (fVar145 * (
                                                  fVar145 * (fVar145 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._28_4_ = auVar161._28_4_ + auVar14._28_4_ + -1.0 + auVar132._28_4_ + 0.0;
                auVar128._8_4_ = 0x7fffffff;
                auVar128._0_8_ = 0x7fffffff7fffffff;
                auVar128._12_4_ = 0x7fffffff;
                auVar128._16_4_ = 0x7fffffff;
                auVar128._20_4_ = 0x7fffffff;
                auVar128._24_4_ = 0x7fffffff;
                auVar128._28_4_ = 0x7fffffff;
                auVar161 = vblendvps_avx(auVar15,auVar128,auVar114);
                auVar129._8_4_ = 0x42b0c0a5;
                auVar129._0_8_ = 0x42b0c0a542b0c0a5;
                auVar129._12_4_ = 0x42b0c0a5;
                auVar129._16_4_ = 0x42b0c0a5;
                auVar129._20_4_ = 0x42b0c0a5;
                auVar129._24_4_ = 0x42b0c0a5;
                auVar129._28_4_ = 0x42b0c0a5;
                auVar161 = vminps_avx(auVar161,auVar129);
                auVar114 = vmaxps_avx(auVar164,auVar161);
                auVar130._0_4_ = auVar114._0_4_ * 1.442695 + fVar78;
                auVar130._4_4_ = auVar114._4_4_ * 1.442695 + fVar79;
                auVar130._8_4_ = auVar114._8_4_ * 1.442695 + fVar80;
                auVar130._12_4_ = auVar114._12_4_ * 1.442695 + fVar81;
                auVar130._16_4_ = auVar114._16_4_ * 1.442695 + fVar82;
                auVar130._20_4_ = auVar114._20_4_ * 1.442695 + fVar83;
                auVar130._24_4_ = auVar114._24_4_ * 1.442695 + fVar177;
                auVar130._28_4_ = fVar178 + 1.442695;
                auVar132 = vroundps_avx(auVar130,1);
                auVar161 = vcmpps_avx(auVar130,auVar132,1);
                auVar161 = vandps_avx(auVar161,auVar131);
                auVar161 = vsubps_avx(auVar132,auVar161);
                auVar16._4_4_ = auVar161._4_4_ * 0.6931472;
                auVar16._0_4_ = auVar161._0_4_ * 0.6931472;
                auVar16._8_4_ = auVar161._8_4_ * 0.6931472;
                auVar16._12_4_ = auVar161._12_4_ * 0.6931472;
                auVar16._16_4_ = auVar161._16_4_ * 0.6931472;
                auVar16._20_4_ = auVar161._20_4_ * 0.6931472;
                auVar16._24_4_ = auVar161._24_4_ * 0.6931472;
                auVar16._28_4_ = auVar132._28_4_;
                auVar163 = ZEXT864(0) << 0x20;
                auVar114 = vsubps_avx(auVar114,auVar16);
                fVar178 = auVar114._0_4_;
                fVar179 = auVar114._4_4_;
                fVar180 = auVar114._8_4_;
                fVar181 = auVar114._12_4_;
                fVar182 = auVar114._16_4_;
                fVar183 = auVar114._20_4_;
                fVar184 = auVar114._24_4_;
                auVar146 = ZEXT3264(auVar131);
                auVar165 = ZEXT3264(auVar165._0_32_);
                auVar147._0_4_ = (int)auVar161._0_4_;
                auVar147._4_4_ = (int)auVar161._4_4_;
                auVar147._8_4_ = (int)auVar161._8_4_;
                auVar147._12_4_ = (int)auVar161._12_4_;
                auVar131._16_4_ = (int)auVar161._16_4_;
                auVar131._0_16_ = auVar147;
                auVar131._20_4_ = (int)auVar161._20_4_;
                auVar131._24_4_ = (int)auVar161._24_4_;
                auVar131._28_4_ = (int)auVar161._28_4_;
                auVar147 = vpslld_avx(auVar147,0x17);
                auVar116 = vpslld_avx(auVar131._16_16_,0x17);
                auVar116 = vpaddd_avx(auVar116,auVar141);
                auVar147 = vpaddd_avx(auVar147,auVar141);
                auVar108._0_4_ =
                     (fVar178 + fVar166 +
                     fVar178 * fVar178 *
                     (fVar78 + ((((fVar178 * 0.00019875691 + 0.0013981999) * fVar178 + 0.008333452)
                                 * fVar178 + 0.041665796) * fVar178 + 0.16666666) * fVar178)) *
                     auVar147._0_4_ + fVar166;
                auVar108._4_4_ =
                     (fVar179 + fVar168 +
                     fVar179 * fVar179 *
                     (fVar79 + ((((fVar179 * 0.00019875691 + 0.0013981999) * fVar179 + 0.008333452)
                                 * fVar179 + 0.041665796) * fVar179 + 0.16666666) * fVar179)) *
                     auVar147._4_4_ + fVar168;
                auVar108._8_4_ =
                     (fVar180 + fVar169 +
                     fVar180 * fVar180 *
                     (fVar80 + ((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452)
                                 * fVar180 + 0.041665796) * fVar180 + 0.16666666) * fVar180)) *
                     auVar147._8_4_ + fVar169;
                auVar108._12_4_ =
                     (fVar181 + fVar170 +
                     fVar181 * fVar181 *
                     (fVar81 + ((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452)
                                 * fVar181 + 0.041665796) * fVar181 + 0.16666666) * fVar181)) *
                     auVar147._12_4_ + fVar170;
                auVar108._16_4_ =
                     (fVar182 + fVar171 +
                     fVar182 * fVar182 *
                     (fVar82 + ((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452)
                                 * fVar182 + 0.041665796) * fVar182 + 0.16666666) * fVar182)) *
                     auVar116._0_4_ + fVar171;
                auVar108._20_4_ =
                     (fVar183 + fVar172 +
                     fVar183 * fVar183 *
                     (fVar83 + ((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452)
                                 * fVar183 + 0.041665796) * fVar183 + 0.16666666) * fVar183)) *
                     auVar116._4_4_ + fVar172;
                auVar108._24_4_ =
                     (fVar184 + fVar173 +
                     fVar184 * fVar184 *
                     (fVar177 +
                     ((((fVar184 * 0.00019875691 + 0.0013981999) * fVar184 + 0.008333452) * fVar184
                      + 0.041665796) * fVar184 + 0.16666666) * fVar184)) * auVar116._8_4_ + fVar173;
                auVar108._28_4_ = auVar114._28_4_ + fVar174 + auVar132._28_4_ + fVar174;
                auVar131 = vrcpps_avx(auVar108);
                fVar166 = auVar131._0_4_;
                fVar168 = auVar131._4_4_;
                fVar169 = auVar131._8_4_;
                fVar170 = auVar131._12_4_;
                fVar171 = auVar131._16_4_;
                fVar172 = auVar131._20_4_;
                fVar173 = auVar131._24_4_;
                auVar161._4_4_ = auVar108._4_4_ * (fVar168 + fVar168);
                auVar161._0_4_ = auVar108._0_4_ * (fVar166 + fVar166);
                auVar161._8_4_ = auVar108._8_4_ * (fVar169 + fVar169);
                auVar161._12_4_ = auVar108._12_4_ * (fVar170 + fVar170);
                auVar161._16_4_ = auVar108._16_4_ * (fVar171 + fVar171);
                auVar161._20_4_ = auVar108._20_4_ * (fVar172 + fVar172);
                auVar161._24_4_ = auVar108._24_4_ * (fVar173 + fVar173);
                auVar161._28_4_ = auVar108._28_4_;
                auVar61._8_4_ = 0x40000000;
                auVar61._0_8_ = 0x4000000040000000;
                auVar61._12_4_ = 0x40000000;
                auVar61._16_4_ = 0x40000000;
                auVar61._20_4_ = 0x40000000;
                auVar61._24_4_ = 0x40000000;
                auVar61._28_4_ = 0x40000000;
                auVar161 = vsubps_avx(auVar61,auVar161);
                auVar132._0_4_ = fVar166 + fVar166 + -1.0;
                auVar132._4_4_ = fVar168 + fVar168 + -1.0;
                auVar132._8_4_ = fVar169 + fVar169 + -1.0;
                auVar132._12_4_ = fVar170 + fVar170 + -1.0;
                auVar132._16_4_ = fVar171 + fVar171 + -1.0;
                auVar132._20_4_ = fVar172 + fVar172 + -1.0;
                auVar132._24_4_ = fVar173 + fVar173 + -1.0;
                auVar132._28_4_ = auVar131._28_4_ + auVar131._28_4_ + -1.0;
                auVar105._0_4_ = auVar132._0_4_ + fVar166 * auVar161._0_4_;
                auVar105._4_4_ = auVar132._4_4_ + fVar168 * auVar161._4_4_;
                auVar105._8_4_ = auVar132._8_4_ + fVar169 * auVar161._8_4_;
                auVar105._12_4_ = auVar132._12_4_ + fVar170 * auVar161._12_4_;
                auVar105._16_4_ = auVar132._16_4_ + fVar171 * auVar161._16_4_;
                auVar105._20_4_ = auVar132._20_4_ + fVar172 * auVar161._20_4_;
                auVar105._24_4_ = auVar132._24_4_ + fVar173 * auVar161._24_4_;
                goto LAB_0053fef7;
              case 6:
                fVar166 = **(float **)(&this->field_0xf8 + (long)p_Var8);
                fVar168 = (*(float **)(&this->field_0xf8 + (long)p_Var8))[1];
                auVar132._4_4_ = fVar168;
                auVar132._0_4_ = fVar168;
                auVar132._8_4_ = fVar168;
                auVar132._12_4_ = fVar168;
                auVar132._16_4_ = fVar168;
                auVar132._20_4_ = fVar168;
                auVar132._24_4_ = fVar168;
                auVar132._28_4_ = fVar168;
                auVar114._0_4_ = fVar166 * fVar62 + fVar168;
                auVar114._4_4_ = fVar166 * fVar77 + fVar168;
                auVar114._8_4_ = fVar166 * auVar74._8_4_ + fVar168;
                auVar114._12_4_ = fVar166 * auVar74._12_4_ + fVar168;
                auVar114._16_4_ = fVar166 * auVar74._16_4_ + fVar168;
                auVar114._20_4_ = fVar166 * auVar74._20_4_ + fVar168;
                auVar114._24_4_ = fVar166 * auVar74._24_4_ + fVar168;
                auVar114._28_4_ = fVar166 + fVar168;
                auVar161 = vmaxps_avx(auVar161,auVar114);
                auVar131 = vminps_avx(auVar161,auVar131);
                auVar105 = auVar131._0_28_;
LAB_0053fef7:
                in_ZMM3 = ZEXT3264(auVar132);
                auVar74._4_4_ = auVar105._4_4_ * fVar77;
                auVar74._0_4_ = auVar105._0_4_ * fVar62;
                auVar74._8_4_ = auVar105._8_4_ * auVar74._8_4_;
                auVar74._12_4_ = auVar105._12_4_ * auVar74._12_4_;
                auVar74._16_4_ = auVar105._16_4_ * auVar74._16_4_;
                auVar74._20_4_ = auVar105._20_4_ * auVar74._20_4_;
                auVar74._24_4_ = auVar105._24_4_ * auVar74._24_4_;
              }
              if (iVar53 == 8) {
                *local_1c8 = auVar74;
                local_1c8 = local_1c8 + 1;
              }
              auVar147 = auVar74._16_16_;
              auVar116 = auVar74._0_16_;
              if (iVar53 == 4) {
                *(undefined1 (*) [16])*local_1c8 = auVar116;
                *(undefined1 (*) [16])((long)*local_1c8 + lVar54 * 4) = auVar147;
                local_1c8 = (undefined1 (*) [32])((long)*local_1c8 + 0x10);
              }
              if (iVar53 == 1) {
                *(int *)*local_1c8 = auVar74._0_4_;
                uVar7 = vextractps_avx(auVar116,1);
                *(undefined4 *)((long)*local_1c8 + lVar54 * 4) = uVar7;
                uVar7 = vextractps_avx(auVar116,2);
                *(undefined4 *)((long)*local_1c8 + (long)(iVar25 * 2) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar116,3);
                *(undefined4 *)((long)*local_1c8 + (long)(iVar25 * 3) * 4) = uVar7;
                *(int *)((long)*local_1c8 + (long)(iVar25 * 4) * 4) = auVar74._16_4_;
                uVar7 = vextractps_avx(auVar147,1);
                *(undefined4 *)((long)*local_1c8 + (long)(iVar25 * 5) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar147,2);
                *(undefined4 *)((long)*local_1c8 + (long)(iVar25 * 6) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar147,3);
                *(undefined4 *)((long)*local_1c8 + local_90 * 4) = uVar7;
                local_1c8 = (undefined1 (*) [32])((long)*local_1c8 + 4);
              }
              local_1e0 = local_1e0 + 1;
              iVar49 = iVar49 + iVar45 * local_d8.elempack;
              local_198 = (Allocator *)((long)local_198 + lVar27 * 4);
              local_1d0 = local_1d0 + lVar27 * 4;
            } while (local_1e0 != lVar28);
          }
          local_1f8 = local_1f8 + 1;
        } while (local_1f8 != uVar48);
      }
      iVar49 = iVar24 + uVar48 * -8;
      iVar53 = iVar49 + 3;
      if (-1 < iVar49) {
        iVar53 = iVar49;
      }
      if (3 < iVar49) {
        local_90 = lVar56 * 4;
        auVar146 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar148._8_4_ = 0x3f800000;
        auVar148._0_8_ = 0x3f8000003f800000;
        auVar148._12_4_ = 0x3f800000;
        local_148 = 0;
        do {
          lVar54 = (long)top_blob->w;
          if (0 < lVar54) {
            uVar46 = local_d8.h * local_d8.elempack;
            uVar29 = (long)(int)(uVar48 * 8) + local_148 * 4;
            iVar49 = top_blob->elempack;
            uVar52 = (uint)uVar29;
            local_1c8 = (undefined1 (*) [32])
                        ((int)((long)((ulong)(uint)((int)uVar52 >> 0x1f) << 0x20 |
                                     uVar29 & 0xffffffff) / (long)iVar49) * lVar54 *
                         top_blob->elemsize + (long)top_blob->data);
            uVar57 = uVar52 + 7;
            if (-1 < (int)uVar52) {
              uVar57 = uVar52;
            }
            local_1d0 = 0;
            iVar39 = 0;
            local_1e0 = 0;
            local_198 = (Allocator *)local_90;
            do {
              auVar163 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar166 = 0.0;
              fVar168 = 0.0;
              fVar169 = 0.0;
              fVar170 = 0.0;
              if (lVar9 != 0) {
                pfVar47 = (float *)(lVar9 + uVar29 * 4);
                fVar166 = *pfVar47;
                fVar168 = pfVar47[1];
                fVar169 = pfVar47[2];
                fVar170 = pfVar47[3];
              }
              local_e8._0_4_ = iVar39;
              pfVar47 = (float *)((this->weight_data_tm).cstep *
                                  (long)(((int)(uVar52 - (uVar57 & 0xfffffff8)) >> 2) +
                                        ((int)uVar57 >> 3)) * (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              if ((int)uVar46 < 8) {
                fVar171 = 0.0;
                fVar172 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar62 = 0.0;
                fVar77 = 0.0;
                fVar78 = 0.0;
                fVar79 = 0.0;
                uVar23 = 0;
              }
              else {
                fVar62 = 0.0;
                fVar77 = 0.0;
                fVar78 = 0.0;
                fVar79 = 0.0;
                fVar171 = 0.0;
                fVar172 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                iVar38 = 0;
                do {
                  lVar28 = (long)(iVar38 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  pfVar51 = (float *)((long)(_func_int ***)local_d8.data +
                                     lVar28 + (long)(local_d8.elempack * iVar45 * (int)local_1e0) *
                                              4);
                  if ((local_d8.elempack == 8) && (0 < iVar5)) {
                    pfVar51 = (float *)((long)(_func_int ***)local_d8.data +
                                       lVar28 + (long)iVar39 * 4);
                    iVar40 = iVar5;
                    do {
                      fVar80 = *pfVar51;
                      fVar81 = pfVar51[1];
                      fVar82 = pfVar51[2];
                      fVar83 = pfVar51[3];
                      fVar177 = pfVar51[4];
                      fVar166 = fVar177 * pfVar47[0x10] + fVar80 * *pfVar47 + fVar166;
                      fVar168 = fVar177 * pfVar47[0x11] + fVar80 * pfVar47[1] + fVar168;
                      fVar169 = fVar177 * pfVar47[0x12] + fVar80 * pfVar47[2] + fVar169;
                      fVar170 = fVar177 * pfVar47[0x13] + fVar80 * pfVar47[3] + fVar170;
                      fVar80 = pfVar51[5];
                      fVar62 = fVar80 * pfVar47[0x14] + fVar62 + fVar81 * pfVar47[4];
                      fVar77 = fVar80 * pfVar47[0x15] + fVar77 + fVar81 * pfVar47[5];
                      fVar78 = fVar80 * pfVar47[0x16] + fVar78 + fVar81 * pfVar47[6];
                      fVar79 = fVar80 * pfVar47[0x17] + fVar79 + fVar81 * pfVar47[7];
                      fVar80 = pfVar51[6];
                      fVar171 = fVar82 * pfVar47[8] + fVar171 + fVar80 * pfVar47[0x18];
                      fVar172 = fVar82 * pfVar47[9] + fVar172 + fVar80 * pfVar47[0x19];
                      fVar173 = fVar82 * pfVar47[10] + fVar173 + fVar80 * pfVar47[0x1a];
                      fVar174 = fVar82 * pfVar47[0xb] + fVar174 + fVar80 * pfVar47[0x1b];
                      fVar80 = pfVar51[7];
                      auVar163 = ZEXT1664(CONCAT412(fVar83 * pfVar47[0xf] + auVar163._12_4_ +
                                                    fVar80 * pfVar47[0x1f],
                                                    CONCAT48(fVar83 * pfVar47[0xe] + auVar163._8_4_
                                                             + fVar80 * pfVar47[0x1e],
                                                             CONCAT44(fVar83 * pfVar47[0xd] +
                                                                      auVar163._4_4_ +
                                                                      fVar80 * pfVar47[0x1d],
                                                                      fVar83 * pfVar47[0xc] +
                                                                      auVar163._0_4_ +
                                                                      fVar80 * pfVar47[0x1c]))));
                      pfVar47 = pfVar47 + 0x20;
                      pfVar51 = pfVar51 + iVar6 * 8;
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  if ((local_d8.elempack == 4) && (iVar40 = iVar5, 0 < iVar5)) {
                    do {
                      fVar80 = *pfVar51;
                      fVar81 = pfVar51[1];
                      fVar82 = pfVar51[2];
                      fVar83 = pfVar51[3];
                      fVar177 = pfVar51[lVar56];
                      fVar166 = fVar177 * pfVar47[0x10] + fVar80 * *pfVar47 + fVar166;
                      fVar168 = fVar177 * pfVar47[0x11] + fVar80 * pfVar47[1] + fVar168;
                      fVar169 = fVar177 * pfVar47[0x12] + fVar80 * pfVar47[2] + fVar169;
                      fVar170 = fVar177 * pfVar47[0x13] + fVar80 * pfVar47[3] + fVar170;
                      fVar80 = pfVar51[lVar56 + 1];
                      fVar62 = fVar80 * pfVar47[0x14] + fVar62 + fVar81 * pfVar47[4];
                      fVar77 = fVar80 * pfVar47[0x15] + fVar77 + fVar81 * pfVar47[5];
                      fVar78 = fVar80 * pfVar47[0x16] + fVar78 + fVar81 * pfVar47[6];
                      fVar79 = fVar80 * pfVar47[0x17] + fVar79 + fVar81 * pfVar47[7];
                      fVar80 = pfVar51[lVar56 + 2];
                      fVar171 = fVar82 * pfVar47[8] + fVar171 + fVar80 * pfVar47[0x18];
                      fVar172 = fVar82 * pfVar47[9] + fVar172 + fVar80 * pfVar47[0x19];
                      fVar173 = fVar82 * pfVar47[10] + fVar173 + fVar80 * pfVar47[0x1a];
                      fVar174 = fVar82 * pfVar47[0xb] + fVar174 + fVar80 * pfVar47[0x1b];
                      fVar80 = pfVar51[lVar56 + 3];
                      auVar163 = ZEXT1664(CONCAT412(fVar83 * pfVar47[0xf] + auVar163._12_4_ +
                                                    fVar80 * pfVar47[0x1f],
                                                    CONCAT48(fVar83 * pfVar47[0xe] + auVar163._8_4_
                                                             + fVar80 * pfVar47[0x1e],
                                                             CONCAT44(fVar83 * pfVar47[0xd] +
                                                                      auVar163._4_4_ +
                                                                      fVar80 * pfVar47[0x1d],
                                                                      fVar83 * pfVar47[0xc] +
                                                                      auVar163._0_4_ +
                                                                      fVar80 * pfVar47[0x1c]))));
                      pfVar47 = pfVar47 + 0x20;
                      pfVar51 = pfVar51 + iVar6 * 4;
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar40 = iVar5, 0 < iVar5)) {
                    do {
                      fVar80 = *pfVar51;
                      fVar81 = pfVar51[lVar56];
                      fVar82 = pfVar51[iVar22 * 2];
                      fVar83 = pfVar51[iVar22 * 3];
                      fVar177 = pfVar51[iVar22 * 4];
                      fVar166 = fVar177 * pfVar47[0x10] + fVar80 * *pfVar47 + fVar166;
                      fVar168 = fVar177 * pfVar47[0x11] + fVar80 * pfVar47[1] + fVar168;
                      fVar169 = fVar177 * pfVar47[0x12] + fVar80 * pfVar47[2] + fVar169;
                      fVar170 = fVar177 * pfVar47[0x13] + fVar80 * pfVar47[3] + fVar170;
                      fVar80 = pfVar51[iVar22 * 5];
                      fVar62 = fVar80 * pfVar47[0x14] + fVar62 + fVar81 * pfVar47[4];
                      fVar77 = fVar80 * pfVar47[0x15] + fVar77 + fVar81 * pfVar47[5];
                      fVar78 = fVar80 * pfVar47[0x16] + fVar78 + fVar81 * pfVar47[6];
                      fVar79 = fVar80 * pfVar47[0x17] + fVar79 + fVar81 * pfVar47[7];
                      fVar80 = pfVar51[iVar22 * 6];
                      fVar171 = fVar82 * pfVar47[8] + fVar171 + fVar80 * pfVar47[0x18];
                      fVar172 = fVar82 * pfVar47[9] + fVar172 + fVar80 * pfVar47[0x19];
                      fVar173 = fVar82 * pfVar47[10] + fVar173 + fVar80 * pfVar47[0x1a];
                      fVar174 = fVar82 * pfVar47[0xb] + fVar174 + fVar80 * pfVar47[0x1b];
                      fVar80 = pfVar51[iVar22 * 7];
                      auVar163 = ZEXT1664(CONCAT412(fVar83 * pfVar47[0xf] + auVar163._12_4_ +
                                                    fVar80 * pfVar47[0x1f],
                                                    CONCAT48(fVar83 * pfVar47[0xe] + auVar163._8_4_
                                                             + fVar80 * pfVar47[0x1e],
                                                             CONCAT44(fVar83 * pfVar47[0xd] +
                                                                      auVar163._4_4_ +
                                                                      fVar80 * pfVar47[0x1d],
                                                                      fVar83 * pfVar47[0xc] +
                                                                      auVar163._0_4_ +
                                                                      fVar80 * pfVar47[0x1c]))));
                      pfVar47 = pfVar47 + 0x20;
                      pfVar51 = pfVar51 + lVar26;
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  iVar40 = iVar38 + 0xf;
                  uVar23 = uVar46 & 0xfffffff8;
                  iVar38 = iVar38 + 8;
                } while (iVar40 < (int)uVar46);
              }
              auVar116 = auVar163._0_16_;
              if ((int)(uVar23 | 3) < (int)uVar46) {
                uVar50 = uVar23;
                do {
                  lVar28 = (long)((int)uVar50 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  pfVar51 = (float *)((long)(_func_int ***)local_d8.data +
                                     lVar28 + (long)(local_d8.elempack * iVar45 * (int)local_1e0) *
                                              4);
                  if ((local_d8.elempack == 4) && (0 < iVar5)) {
                    pfVar51 = (float *)((long)(_func_int ***)local_d8.data +
                                       lVar28 + (long)iVar39 * 4);
                    iVar38 = iVar5;
                    do {
                      fVar80 = *pfVar51;
                      fVar166 = fVar80 * *pfVar47 + fVar166;
                      fVar168 = fVar80 * pfVar47[1] + fVar168;
                      fVar169 = fVar80 * pfVar47[2] + fVar169;
                      fVar170 = fVar80 * pfVar47[3] + fVar170;
                      fVar80 = pfVar51[1];
                      fVar62 = fVar62 + fVar80 * pfVar47[4];
                      fVar77 = fVar77 + fVar80 * pfVar47[5];
                      fVar78 = fVar78 + fVar80 * pfVar47[6];
                      fVar79 = fVar79 + fVar80 * pfVar47[7];
                      fVar80 = pfVar51[2];
                      fVar171 = fVar171 + fVar80 * pfVar47[8];
                      fVar172 = fVar172 + fVar80 * pfVar47[9];
                      fVar173 = fVar173 + fVar80 * pfVar47[10];
                      fVar174 = fVar174 + fVar80 * pfVar47[0xb];
                      fVar80 = pfVar51[3];
                      auVar163 = ZEXT1664(CONCAT412(fVar80 * pfVar47[0xf] + auVar163._12_4_,
                                                    CONCAT48(fVar80 * pfVar47[0xe] + auVar163._8_4_,
                                                             CONCAT44(fVar80 * pfVar47[0xd] +
                                                                      auVar163._4_4_,
                                                                      fVar80 * pfVar47[0xc] +
                                                                      auVar163._0_4_))));
                      pfVar47 = pfVar47 + 0x10;
                      pfVar51 = pfVar51 + iVar6 * 4;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar38 = iVar5, 0 < iVar5)) {
                    do {
                      fVar80 = *pfVar51;
                      fVar166 = fVar80 * *pfVar47 + fVar166;
                      fVar168 = fVar80 * pfVar47[1] + fVar168;
                      fVar169 = fVar80 * pfVar47[2] + fVar169;
                      fVar170 = fVar80 * pfVar47[3] + fVar170;
                      fVar80 = pfVar51[lVar56];
                      fVar62 = fVar62 + fVar80 * pfVar47[4];
                      fVar77 = fVar77 + fVar80 * pfVar47[5];
                      fVar78 = fVar78 + fVar80 * pfVar47[6];
                      fVar79 = fVar79 + fVar80 * pfVar47[7];
                      fVar80 = pfVar51[iVar22 * 2];
                      fVar171 = fVar171 + fVar80 * pfVar47[8];
                      fVar172 = fVar172 + fVar80 * pfVar47[9];
                      fVar173 = fVar173 + fVar80 * pfVar47[10];
                      fVar174 = fVar174 + fVar80 * pfVar47[0xb];
                      fVar80 = pfVar51[iVar22 * 3];
                      auVar163 = ZEXT1664(CONCAT412(fVar80 * pfVar47[0xf] + auVar163._12_4_,
                                                    CONCAT48(fVar80 * pfVar47[0xe] + auVar163._8_4_,
                                                             CONCAT44(fVar80 * pfVar47[0xd] +
                                                                      auVar163._4_4_,
                                                                      fVar80 * pfVar47[0xc] +
                                                                      auVar163._0_4_))));
                      pfVar47 = pfVar47 + 0x10;
                      pfVar51 = pfVar51 + lVar26;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  auVar116 = auVar163._0_16_;
                  uVar23 = uVar50 + 4;
                  iVar38 = uVar50 + 7;
                  uVar50 = uVar23;
                } while (iVar38 < (int)uVar46);
              }
              uVar30 = (ulong)uVar23;
              if ((int)(uVar23 | 1) < (int)uVar46) {
                lVar28 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                lVar35 = lVar28 * uVar30;
                lVar36 = (long)(_func_int ***)local_d8.data + lVar35 + (long)local_198;
                lVar28 = lVar28 * 2;
                lVar35 = (long)(_func_int ***)local_d8.data + lVar35 + local_1d0;
                do {
                  if (0 < iVar5) {
                    lVar58 = 0;
                    iVar38 = iVar5;
                    do {
                      fVar80 = *(float *)(lVar35 + lVar58);
                      fVar166 = fVar80 * *pfVar47 + fVar166;
                      fVar168 = fVar80 * pfVar47[1] + fVar168;
                      fVar169 = fVar80 * pfVar47[2] + fVar169;
                      fVar170 = fVar80 * pfVar47[3] + fVar170;
                      fVar80 = *(float *)(lVar36 + lVar58);
                      fVar62 = fVar62 + fVar80 * pfVar47[4];
                      fVar77 = fVar77 + fVar80 * pfVar47[5];
                      fVar78 = fVar78 + fVar80 * pfVar47[6];
                      fVar79 = fVar79 + fVar80 * pfVar47[7];
                      pfVar47 = pfVar47 + 8;
                      lVar58 = lVar58 + lVar26 * 4;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  uVar30 = uVar30 + 2;
                  uVar23 = (uint)uVar30;
                  lVar36 = lVar36 + lVar28;
                  lVar35 = lVar35 + lVar28;
                } while ((int)(uVar23 | 1) < (int)uVar46);
              }
              if ((int)uVar23 < (int)uVar46) {
                lVar28 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                uVar30 = (ulong)uVar23;
                pfVar51 = (float *)((long)(_func_int ***)local_d8.data + lVar28 * uVar30 + local_1d0
                                   );
                do {
                  pfVar32 = pfVar51;
                  iVar38 = iVar5;
                  if (0 < iVar5) {
                    do {
                      fVar80 = *pfVar32;
                      fVar166 = fVar80 * *pfVar47 + fVar166;
                      fVar168 = fVar80 * pfVar47[1] + fVar168;
                      fVar169 = fVar80 * pfVar47[2] + fVar169;
                      fVar170 = fVar80 * pfVar47[3] + fVar170;
                      pfVar47 = pfVar47 + 4;
                      pfVar32 = pfVar32 + lVar26;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  uVar30 = uVar30 + 1;
                  pfVar51 = (float *)((long)pfVar51 + lVar28);
                } while ((int)uVar30 < (int)uVar46);
              }
              auVar63._0_4_ = fVar171 + auVar116._0_4_ + fVar62 + fVar166;
              auVar63._4_4_ = fVar172 + auVar116._4_4_ + fVar77 + fVar168;
              auVar63._8_4_ = fVar173 + auVar116._8_4_ + fVar78 + fVar169;
              auVar63._12_4_ = fVar174 + auVar116._12_4_ + fVar79 + fVar170;
              fVar166 = auVar146._0_4_;
              fVar168 = auVar146._4_4_;
              fVar169 = auVar146._8_4_;
              fVar170 = auVar146._12_4_;
              switch(uVar34) {
              case 1:
                auVar63 = vmaxps_avx(auVar63,_DAT_00595090);
                break;
              case 2:
                auVar116 = vmaxps_avx(auVar63,ZEXT816(0) << 0x40);
                auVar147 = vminps_avx(auVar63,ZEXT816(0) << 0x40);
                fVar166 = **(float **)(&this->field_0xf8 + (long)p_Var8);
                auVar63._0_4_ = fVar166 * auVar147._0_4_ + auVar116._0_4_;
                auVar63._4_4_ = fVar166 * auVar147._4_4_ + auVar116._4_4_;
                auVar63._8_4_ = fVar166 * auVar147._8_4_ + auVar116._8_4_;
                auVar63._12_4_ = fVar166 * auVar147._12_4_ + auVar116._12_4_;
                break;
              case 3:
                uVar7 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var8);
                auVar90._4_4_ = uVar7;
                auVar90._0_4_ = uVar7;
                auVar90._8_4_ = uVar7;
                auVar90._12_4_ = uVar7;
                uVar7 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var8))[1];
                auVar157._4_4_ = uVar7;
                auVar157._0_4_ = uVar7;
                auVar157._8_4_ = uVar7;
                auVar157._12_4_ = uVar7;
                auVar116 = vmaxps_avx(auVar63,auVar90);
                auVar63 = vminps_avx(auVar116,auVar157);
                break;
              case 4:
                uVar30 = CONCAT44(auVar63._4_4_,auVar63._0_4_);
                auVar64._0_8_ = uVar30 ^ 0x8000000080000000;
                auVar64._8_4_ = -auVar63._8_4_;
                auVar64._12_4_ = -auVar63._12_4_;
                auVar91._8_4_ = 0x42b0c0a5;
                auVar91._0_8_ = 0x42b0c0a542b0c0a5;
                auVar91._12_4_ = 0x42b0c0a5;
                auVar116 = vminps_avx(auVar64,auVar91);
                auVar92._8_4_ = 0xc2b0c0a5;
                auVar92._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar92._12_4_ = 0xc2b0c0a5;
                auVar141 = vmaxps_avx(auVar116,auVar92);
                auVar93._0_4_ = fVar166 + auVar141._0_4_ * 1.442695;
                auVar93._4_4_ = fVar168 + auVar141._4_4_ * 1.442695;
                auVar93._8_4_ = fVar169 + auVar141._8_4_ * 1.442695;
                auVar93._12_4_ = fVar170 + auVar141._12_4_ * 1.442695;
                auVar158._0_4_ = (int)auVar93._0_4_;
                auVar158._4_4_ = (int)auVar93._4_4_;
                auVar158._8_4_ = (int)auVar93._8_4_;
                auVar158._12_4_ = (int)auVar93._12_4_;
                auVar147 = vcvtdq2ps_avx(auVar158);
                auVar116 = vcmpps_avx(auVar93,auVar147,1);
                auVar116 = vandps_avx(auVar116,auVar148);
                auVar116 = vsubps_avx(auVar147,auVar116);
                fVar171 = auVar141._0_4_ + auVar116._0_4_ * -0.6931472;
                fVar172 = auVar141._4_4_ + auVar116._4_4_ * -0.6931472;
                fVar173 = auVar141._8_4_ + auVar116._8_4_ * -0.6931472;
                fVar174 = auVar141._12_4_ + auVar116._12_4_ * -0.6931472;
                auVar94._0_4_ = (int)auVar116._0_4_;
                auVar94._4_4_ = (int)auVar116._4_4_;
                auVar94._8_4_ = (int)auVar116._8_4_;
                auVar94._12_4_ = (int)auVar116._12_4_;
                auVar116 = vpslld_avx(auVar94,0x17);
                auVar116 = vpaddd_avx(auVar116,auVar148);
                auVar65._0_4_ =
                     (fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + fVar166) *
                     fVar171 * fVar171) * auVar116._0_4_ + 1.0;
                auVar65._4_4_ =
                     (fVar172 + 1.0 +
                     (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172
                       + 0.041665796) * fVar172 + 0.16666666) * fVar172 + fVar168) *
                     fVar172 * fVar172) * auVar116._4_4_ + 1.0;
                auVar65._8_4_ =
                     (fVar173 + 1.0 +
                     (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173
                       + 0.041665796) * fVar173 + 0.16666666) * fVar173 + fVar169) *
                     fVar173 * fVar173) * auVar116._8_4_ + 1.0;
                auVar65._12_4_ =
                     (fVar174 + 1.0 +
                     (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174
                       + 0.041665796) * fVar174 + 0.16666666) * fVar174 + fVar170) *
                     fVar174 * fVar174) * auVar116._12_4_ + 1.0;
                auVar116 = vrcpps_avx(auVar65);
                fVar166 = auVar116._0_4_;
                auVar66._0_4_ = auVar65._0_4_ * fVar166;
                fVar168 = auVar116._4_4_;
                auVar66._4_4_ = auVar65._4_4_ * fVar168;
                fVar169 = auVar116._8_4_;
                auVar66._8_4_ = auVar65._8_4_ * fVar169;
                fVar170 = auVar116._12_4_;
                auVar66._12_4_ = auVar65._12_4_ * fVar170;
                auVar116 = vsubps_avx(auVar148,auVar66);
                auVar63._0_4_ = fVar166 + fVar166 * auVar116._0_4_;
                auVar63._4_4_ = fVar168 + fVar168 * auVar116._4_4_;
                auVar63._8_4_ = fVar169 + fVar169 * auVar116._8_4_;
                auVar63._12_4_ = fVar170 + fVar170 * auVar116._12_4_;
                break;
              case 5:
                auVar142._8_4_ = 0x42b0c0a5;
                auVar142._0_8_ = 0x42b0c0a542b0c0a5;
                auVar142._12_4_ = 0x42b0c0a5;
                auVar116 = vminps_avx(auVar63,auVar142);
                auVar160._8_4_ = 0xc2b0c0a5;
                auVar160._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar160._12_4_ = 0xc2b0c0a5;
                auVar141 = vmaxps_avx(auVar160,auVar116);
                auVar152._0_4_ = fVar166 + auVar141._0_4_ * 1.442695;
                auVar152._4_4_ = fVar168 + auVar141._4_4_ * 1.442695;
                auVar152._8_4_ = fVar169 + auVar141._8_4_ * 1.442695;
                auVar152._12_4_ = fVar170 + auVar141._12_4_ * 1.442695;
                auVar175._0_4_ = (int)auVar152._0_4_;
                auVar175._4_4_ = (int)auVar152._4_4_;
                auVar175._8_4_ = (int)auVar152._8_4_;
                auVar175._12_4_ = (int)auVar152._12_4_;
                auVar147 = vcvtdq2ps_avx(auVar175);
                auVar116 = vcmpps_avx(auVar152,auVar147,1);
                auVar116 = vandps_avx(auVar116,auVar148);
                auVar116 = vsubps_avx(auVar147,auVar116);
                auVar176._0_4_ = auVar116._0_4_ * 0.6931472;
                auVar176._4_4_ = auVar116._4_4_ * 0.6931472;
                auVar176._8_4_ = auVar116._8_4_ * 0.6931472;
                auVar176._12_4_ = auVar116._12_4_ * 0.6931472;
                auVar147 = vsubps_avx(auVar141,auVar176);
                fVar171 = auVar147._0_4_;
                fVar172 = auVar147._4_4_;
                fVar173 = auVar147._8_4_;
                fVar174 = auVar147._12_4_;
                auVar153._0_4_ = (int)auVar116._0_4_;
                auVar153._4_4_ = (int)auVar116._4_4_;
                auVar153._8_4_ = (int)auVar116._8_4_;
                auVar153._12_4_ = (int)auVar116._12_4_;
                auVar116 = vpslld_avx(auVar153,0x17);
                auVar116 = vpaddd_avx(auVar116,auVar148);
                auVar154._0_4_ =
                     (fVar171 * fVar171 *
                      (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) *
                         fVar171 + 0.041665796) * fVar171 + 0.16666666) * fVar171 + fVar166) +
                     fVar171 + 1.0) * auVar116._0_4_ + 1.0;
                auVar154._4_4_ =
                     (fVar172 * fVar172 *
                      (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) *
                         fVar172 + 0.041665796) * fVar172 + 0.16666666) * fVar172 + fVar168) +
                     fVar172 + 1.0) * auVar116._4_4_ + 1.0;
                auVar154._8_4_ =
                     (fVar173 * fVar173 *
                      (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) *
                         fVar173 + 0.041665796) * fVar173 + 0.16666666) * fVar173 + fVar169) +
                     fVar173 + 1.0) * auVar116._8_4_ + 1.0;
                auVar154._12_4_ =
                     (fVar174 * fVar174 *
                      (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) *
                         fVar174 + 0.041665796) * fVar174 + 0.16666666) * fVar174 + fVar170) +
                     fVar174 + 1.0) * auVar116._12_4_ + 1.0;
                auVar85._8_4_ = 0x800000;
                auVar85._0_8_ = 0x80000000800000;
                auVar85._12_4_ = 0x800000;
                auVar116 = vmaxps_avx(auVar154,auVar85);
                auVar147 = vpsrld_avx(auVar116,0x17);
                auVar117._8_4_ = 0xffffff82;
                auVar117._0_8_ = 0xffffff82ffffff82;
                auVar117._12_4_ = 0xffffff82;
                auVar147 = vpaddd_avx(auVar147,auVar117);
                auVar118._8_4_ = 0x807fffff;
                auVar118._0_8_ = 0x807fffff807fffff;
                auVar118._12_4_ = 0x807fffff;
                auVar116 = vandps_avx(auVar116,auVar118);
                auVar151 = vorps_avx(auVar116,auVar146._0_16_);
                auVar141 = vcvtdq2ps_avx(auVar147);
                auVar119._8_4_ = 0x3f3504f3;
                auVar119._0_8_ = 0x3f3504f33f3504f3;
                auVar119._12_4_ = 0x3f3504f3;
                auVar147 = vcmpps_avx(auVar151,auVar119,1);
                auVar116 = vandps_avx(auVar147,auVar151);
                fVar171 = auVar151._0_4_ + -1.0 + auVar116._0_4_;
                fVar172 = auVar151._4_4_ + -1.0 + auVar116._4_4_;
                fVar173 = auVar151._8_4_ + -1.0 + auVar116._8_4_;
                fVar174 = auVar151._12_4_ + -1.0 + auVar116._12_4_;
                auVar116 = vandps_avx(auVar147,auVar148);
                auVar147 = vsubps_avx(auVar141,auVar116);
                auVar116 = vcmpps_avx(auVar154,_DAT_00595090,2);
                auVar86._0_4_ =
                     (fVar171 * fVar171 *
                      (((((((((fVar171 * 0.070376836 + -0.1151461) * fVar171 + 0.116769984) *
                             fVar171 + -0.12420141) * fVar171 + 0.14249323) * fVar171 + -0.16668057)
                          * fVar171 + 0.20000714) * fVar171 + -0.24999994) * fVar171 + 0.3333333) *
                       fVar171 + -0.5) + auVar147._0_4_ * 0.6931472 + fVar171) * -2.0;
                auVar86._4_4_ =
                     (fVar172 * fVar172 *
                      (((((((((fVar172 * 0.070376836 + -0.1151461) * fVar172 + 0.116769984) *
                             fVar172 + -0.12420141) * fVar172 + 0.14249323) * fVar172 + -0.16668057)
                          * fVar172 + 0.20000714) * fVar172 + -0.24999994) * fVar172 + 0.3333333) *
                       fVar172 + -0.5) + auVar147._4_4_ * 0.6931472 + fVar172) * -2.0;
                auVar86._8_4_ =
                     (fVar173 * fVar173 *
                      (((((((((fVar173 * 0.070376836 + -0.1151461) * fVar173 + 0.116769984) *
                             fVar173 + -0.12420141) * fVar173 + 0.14249323) * fVar173 + -0.16668057)
                          * fVar173 + 0.20000714) * fVar173 + -0.24999994) * fVar173 + 0.3333333) *
                       fVar173 + -0.5) + auVar147._8_4_ * 0.6931472 + fVar173) * -2.0;
                auVar86._12_4_ =
                     (fVar174 * fVar174 *
                      (((((((((fVar174 * 0.070376836 + -0.1151461) * fVar174 + 0.116769984) *
                             fVar174 + -0.12420141) * fVar174 + 0.14249323) * fVar174 + -0.16668057)
                          * fVar174 + 0.20000714) * fVar174 + -0.24999994) * fVar174 + 0.3333333) *
                       fVar174 + -0.5) + auVar147._12_4_ * 0.6931472 + fVar174) * -2.0;
                auVar120._8_4_ = 0x7fffffff;
                auVar120._0_8_ = 0x7fffffff7fffffff;
                auVar120._12_4_ = 0x7fffffff;
                auVar116 = vblendvps_avx(auVar86,auVar120,auVar116);
                auVar121._8_4_ = 0x42b0c0a5;
                auVar121._0_8_ = 0x42b0c0a542b0c0a5;
                auVar121._12_4_ = 0x42b0c0a5;
                auVar116 = vminps_avx(auVar116,auVar121);
                auVar122._8_4_ = 0xc2b0c0a5;
                auVar122._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar122._12_4_ = 0xc2b0c0a5;
                auVar141 = vmaxps_avx(auVar116,auVar122);
                auVar123._0_4_ = auVar141._0_4_ * 1.442695 + fVar166;
                auVar123._4_4_ = auVar141._4_4_ * 1.442695 + fVar168;
                auVar123._8_4_ = auVar141._8_4_ * 1.442695 + fVar169;
                auVar123._12_4_ = auVar141._12_4_ * 1.442695 + fVar170;
                auVar155._0_4_ = (int)auVar123._0_4_;
                auVar155._4_4_ = (int)auVar123._4_4_;
                auVar155._8_4_ = (int)auVar123._8_4_;
                auVar155._12_4_ = (int)auVar123._12_4_;
                auVar147 = vcvtdq2ps_avx(auVar155);
                auVar116 = vcmpps_avx(auVar123,auVar147,1);
                auVar116 = vandps_avx(auVar116,auVar148);
                auVar116 = vsubps_avx(auVar147,auVar116);
                auVar156._0_4_ = auVar116._0_4_ * 0.6931472;
                auVar156._4_4_ = auVar116._4_4_ * 0.6931472;
                auVar156._8_4_ = auVar116._8_4_ * 0.6931472;
                auVar156._12_4_ = auVar116._12_4_ * 0.6931472;
                auVar147 = vsubps_avx(auVar141,auVar156);
                fVar171 = auVar147._0_4_;
                fVar172 = auVar147._4_4_;
                fVar173 = auVar147._8_4_;
                fVar174 = auVar147._12_4_;
                auVar146 = ZEXT1664(auVar146._0_16_);
                auVar124._0_4_ = (int)auVar116._0_4_;
                auVar124._4_4_ = (int)auVar116._4_4_;
                auVar124._8_4_ = (int)auVar116._8_4_;
                auVar124._12_4_ = (int)auVar116._12_4_;
                auVar116 = vpslld_avx(auVar124,0x17);
                auVar116 = vpaddd_avx(auVar116,auVar148);
                auVar87._0_4_ =
                     (fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + fVar166) *
                     fVar171 * fVar171) * auVar116._0_4_ + 1.0;
                auVar87._4_4_ =
                     (fVar172 + 1.0 +
                     (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172
                       + 0.041665796) * fVar172 + 0.16666666) * fVar172 + fVar168) *
                     fVar172 * fVar172) * auVar116._4_4_ + 1.0;
                auVar87._8_4_ =
                     (fVar173 + 1.0 +
                     (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173
                       + 0.041665796) * fVar173 + 0.16666666) * fVar173 + fVar169) *
                     fVar173 * fVar173) * auVar116._8_4_ + 1.0;
                auVar87._12_4_ =
                     (fVar174 + 1.0 +
                     (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174
                       + 0.041665796) * fVar174 + 0.16666666) * fVar174 + fVar170) *
                     fVar174 * fVar174) * auVar116._12_4_ + 1.0;
                auVar116 = vrcpps_avx(auVar87);
                fVar166 = auVar116._0_4_;
                fVar168 = auVar116._4_4_;
                fVar169 = auVar116._8_4_;
                fVar170 = auVar116._12_4_;
                auVar88._0_4_ = auVar87._0_4_ * (fVar166 + fVar166);
                auVar88._4_4_ = auVar87._4_4_ * (fVar168 + fVar168);
                auVar88._8_4_ = auVar87._8_4_ * (fVar169 + fVar169);
                auVar88._12_4_ = auVar87._12_4_ * (fVar170 + fVar170);
                auVar143._8_4_ = 0x40000000;
                auVar143._0_8_ = 0x4000000040000000;
                auVar143._12_4_ = 0x40000000;
                in_ZMM4 = ZEXT1664(auVar143);
                auVar116 = vsubps_avx(auVar143,auVar88);
                auVar89._0_4_ = fVar166 + fVar166 + -1.0 + fVar166 * auVar116._0_4_;
                auVar89._4_4_ = fVar168 + fVar168 + -1.0 + fVar168 * auVar116._4_4_;
                auVar89._8_4_ = fVar169 + fVar169 + -1.0 + fVar169 * auVar116._8_4_;
                auVar89._12_4_ = fVar170 + fVar170 + -1.0 + fVar170 * auVar116._12_4_;
                goto LAB_00540bd9;
              case 6:
                fVar166 = **(float **)(&this->field_0xf8 + (long)p_Var8);
                fVar168 = (*(float **)(&this->field_0xf8 + (long)p_Var8))[1];
                auVar95._0_4_ = fVar166 * auVar63._0_4_ + fVar168;
                auVar95._4_4_ = fVar166 * auVar63._4_4_ + fVar168;
                auVar95._8_4_ = fVar166 * auVar63._8_4_ + fVar168;
                auVar95._12_4_ = fVar166 * auVar63._12_4_ + fVar168;
                auVar116 = vmaxps_avx(auVar95,_DAT_00595090);
                auVar89 = vminps_avx(auVar116,auVar148);
LAB_00540bd9:
                auVar63._0_4_ = auVar89._0_4_ * auVar63._0_4_;
                auVar63._4_4_ = auVar89._4_4_ * auVar63._4_4_;
                auVar63._8_4_ = auVar89._8_4_ * auVar63._8_4_;
                auVar63._12_4_ = auVar89._12_4_ * auVar63._12_4_;
              }
              if (iVar49 == 4) {
                *(undefined1 (*) [16])local_1c8 = auVar63;
                local_1c8 = (undefined1 (*) [32])((long)local_1c8 + 0x10);
              }
              if (iVar49 == 1) {
                *(int *)*local_1c8 = auVar63._0_4_;
                uVar7 = vextractps_avx(auVar63,1);
                *(undefined4 *)((long)*local_1c8 + (long)iVar25 * 4) = uVar7;
                uVar7 = vextractps_avx(auVar63,2);
                *(undefined4 *)((long)*local_1c8 + (long)(iVar25 * 2) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar63,3);
                *(undefined4 *)((long)*local_1c8 + (long)(iVar25 * 3) * 4) = uVar7;
                local_1c8 = (undefined1 (*) [32])((long)*local_1c8 + 4);
              }
              local_1e0 = local_1e0 + 1;
              iVar39 = iVar39 + iVar45 * local_d8.elempack;
              local_198 = (Allocator *)((long)local_198 + lVar27 * 4);
              local_1d0 = local_1d0 + lVar27 * 4;
            } while (local_1e0 != lVar54);
          }
          local_148 = local_148 + 1;
        } while (local_148 != (uint)(iVar53 >> 2));
      }
      uVar34 = uVar48 * 8 + (iVar53 >> 2) * 4;
      local_68 = (ulong)uVar34;
      local_70 = (ulong)(uint)((int)(iVar24 - uVar34) / 2);
      if (1 < (int)(iVar24 - uVar34)) {
        iVar53 = local_d8.h * local_d8.elempack;
        uVar48 = top_blob->w;
        lVar54 = (long)(int)uVar48 * top_blob->elemsize;
        iVar24 = local_d8.elempack * iVar45;
        local_38 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
        bVar59 = local_d8.elempack == 1;
        local_90 = CONCAT44(local_90._4_4_,iVar53) & 0xfffffffffffffff8;
        iVar25 = local_d8.elempack * iVar45;
        local_40 = top_blob->data;
        local_48 = (this->weight_data_tm).data;
        local_50 = (long)(int)uVar34;
        local_58 = lVar56 * 4;
        local_140 = 0;
        local_78 = local_70;
        do {
          pvVar10 = local_d8.data;
          if (0 < (int)uVar48) {
            lVar28 = local_50 + local_140 * 2;
            pfVar47 = (float *)((local_50 + local_140 * 2 + 1) * lVar54 + (long)local_40);
            pfVar51 = (float *)(lVar28 * lVar54 + (long)local_40);
            uVar34 = (uint)lVar28;
            uVar46 = uVar34 + 3;
            uVar57 = uVar34 + 7;
            if (-1 < (int)uVar34) {
              uVar46 = uVar34;
              uVar57 = uVar34;
            }
            iVar39 = uVar34 - (uVar57 & 0xfffffff8);
            iVar49 = (uVar34 - (uVar57 & 0xfffffff8)) + 3;
            if (-1 < iVar39) {
              iVar49 = iVar39;
            }
            pfVar31 = (float *)((((int)(uVar34 - (uVar46 & 0xfffffffc)) >> 1) + ((int)uVar57 >> 3) +
                                (iVar49 >> 2)) * local_38 + (long)local_48);
            lVar35 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
            pfVar32 = *(float **)(&this->field_0xf8 + (long)p_Var8);
            local_120 = (long)(_func_int ***)local_d8.data + local_58;
            iVar49 = 0;
            local_158 = (Allocator *)local_d8.data;
            local_1b8 = 0;
            do {
              if (lVar9 == 0) {
                fVar166 = 0.0;
                fVar168 = 0.0;
              }
              else {
                pfVar33 = (float *)(lVar9 + lVar28 * 4);
                fVar166 = *pfVar33;
                fVar168 = pfVar33[1];
              }
              pvVar41 = (void *)((long)iVar49 * 4);
              pfVar33 = pfVar31;
              if (iVar53 < 8) {
                uVar34 = 0;
                fVar78 = 0.0;
                fVar79 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                fVar82 = 0.0;
                fVar83 = 0.0;
                fVar177 = 0.0;
                fVar178 = 0.0;
                fVar169 = 0.0;
                fVar170 = 0.0;
                fVar171 = 0.0;
                fVar172 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar62 = 0.0;
                fVar77 = 0.0;
              }
              else {
                fVar169 = 0.0;
                fVar170 = 0.0;
                fVar171 = 0.0;
                fVar172 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar62 = 0.0;
                fVar77 = 0.0;
                fVar78 = 0.0;
                fVar79 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                fVar82 = 0.0;
                fVar83 = 0.0;
                fVar177 = 0.0;
                fVar178 = 0.0;
                iVar39 = 0;
                do {
                  lVar36 = (iVar39 / iVar4) * lVar35;
                  pfVar42 = (float *)((long)(_func_int ***)pvVar10 +
                                     lVar36 + (long)(iVar24 * (int)local_1b8) * 4);
                  auVar146 = in_ZMM4;
                  if ((iVar4 == 8) && (0 < iVar5)) {
                    pfVar42 = (float *)((long)(_func_int ***)pvVar10 +
                                       (long)(lVar36 + (long)pvVar41));
                    iVar38 = iVar5;
                    do {
                      auVar163._0_4_ = *pfVar42 * *pfVar33;
                      auVar163._4_4_ = pfVar42[1] * pfVar33[1];
                      auVar163._8_4_ = pfVar42[2] * pfVar33[2];
                      auVar163._12_4_ = pfVar42[3] * pfVar33[3];
                      auVar163._16_4_ = pfVar42[4] * pfVar33[4];
                      auVar163._20_4_ = pfVar42[5] * pfVar33[5];
                      auVar163._28_36_ = in_ZMM4._28_36_;
                      auVar163._24_4_ = pfVar42[6] * pfVar33[6];
                      auVar146 = ZEXT3264(auVar163._0_32_);
                      fVar78 = auVar163._0_4_ + fVar78;
                      fVar79 = auVar163._4_4_ + fVar79;
                      fVar80 = auVar163._8_4_ + fVar80;
                      fVar81 = auVar163._12_4_ + fVar81;
                      fVar82 = auVar163._16_4_ + fVar82;
                      fVar83 = auVar163._20_4_ + fVar83;
                      fVar177 = auVar163._24_4_ + fVar177;
                      fVar178 = in_ZMM4._28_4_ + fVar178;
                      fVar169 = *pfVar42 * pfVar33[8] + fVar169;
                      fVar170 = pfVar42[1] * pfVar33[9] + fVar170;
                      fVar171 = pfVar42[2] * pfVar33[10] + fVar171;
                      fVar172 = pfVar42[3] * pfVar33[0xb] + fVar172;
                      fVar173 = pfVar42[4] * pfVar33[0xc] + fVar173;
                      fVar174 = pfVar42[5] * pfVar33[0xd] + fVar174;
                      fVar62 = pfVar42[6] * pfVar33[0xe] + fVar62;
                      fVar77 = pfVar42[7] + fVar77;
                      pfVar33 = pfVar33 + 0x10;
                      pfVar42 = pfVar42 + iVar6 * 8;
                      iVar38 = iVar38 + -1;
                      in_ZMM4 = auVar146;
                    } while (iVar38 != 0);
                  }
                  in_ZMM4 = auVar146;
                  if ((iVar4 == 4) && (iVar38 = iVar5, 0 < iVar5)) {
                    do {
                      auVar165._0_4_ = *pfVar42 * *pfVar33;
                      auVar165._4_4_ = pfVar42[1] * pfVar33[1];
                      auVar165._8_4_ = pfVar42[2] * pfVar33[2];
                      auVar165._12_4_ = pfVar42[3] * pfVar33[3];
                      auVar165._16_4_ = pfVar42[lVar56 + 4] * pfVar33[4];
                      auVar165._20_4_ = pfVar42[lVar56 + 5] * pfVar33[5];
                      auVar165._28_36_ = auVar146._28_36_;
                      auVar165._24_4_ = pfVar42[lVar56 + 6] * pfVar33[6];
                      in_ZMM4 = ZEXT3264(auVar165._0_32_);
                      fVar78 = auVar165._0_4_ + fVar78;
                      fVar79 = auVar165._4_4_ + fVar79;
                      fVar80 = auVar165._8_4_ + fVar80;
                      fVar81 = auVar165._12_4_ + fVar81;
                      fVar82 = auVar165._16_4_ + fVar82;
                      fVar83 = auVar165._20_4_ + fVar83;
                      fVar177 = auVar165._24_4_ + fVar177;
                      fVar178 = auVar146._28_4_ + fVar178;
                      fVar169 = *pfVar42 * pfVar33[8] + fVar169;
                      fVar170 = pfVar42[1] * pfVar33[9] + fVar170;
                      fVar171 = pfVar42[2] * pfVar33[10] + fVar171;
                      fVar172 = pfVar42[3] * pfVar33[0xb] + fVar172;
                      fVar173 = pfVar42[lVar56 + 4] * pfVar33[0xc] + fVar173;
                      fVar174 = pfVar42[lVar56 + 5] * pfVar33[0xd] + fVar174;
                      fVar62 = pfVar42[lVar56 + 6] * pfVar33[0xe] + fVar62;
                      fVar77 = pfVar42[lVar56 + 7] + fVar77;
                      pfVar33 = pfVar33 + 0x10;
                      pfVar42 = pfVar42 + iVar6 * 4;
                      iVar38 = iVar38 + -1;
                      auVar146 = in_ZMM4;
                    } while (iVar38 != 0);
                  }
                  iVar38 = iVar5;
                  if (0 < iVar5 && bVar59) {
                    do {
                      auVar116 = vinsertps_avx(ZEXT416((uint)*pfVar42),
                                               ZEXT416((uint)pfVar42[lVar56]),0x10);
                      auVar116 = vinsertps_avx(auVar116,ZEXT416((uint)pfVar42[iVar22 * 2]),0x20);
                      auVar116 = vinsertps_avx(auVar116,ZEXT416((uint)pfVar42[iVar22 * 3]),0x30);
                      auVar147 = vinsertps_avx(ZEXT416((uint)pfVar42[iVar22 * 4]),
                                               ZEXT416((uint)pfVar42[iVar22 * 5]),0x10);
                      auVar147 = vinsertps_avx(auVar147,ZEXT416((uint)pfVar42[iVar22 * 6]),0x20);
                      auVar147 = vinsertps_avx(auVar147,ZEXT416((uint)pfVar42[iVar22 * 7]),0x30);
                      fVar179 = auVar116._0_4_ * *pfVar33;
                      fVar180 = auVar116._4_4_ * pfVar33[1];
                      fVar181 = auVar116._8_4_ * pfVar33[2];
                      fVar182 = auVar116._12_4_ * pfVar33[3];
                      fVar183 = auVar147._0_4_ * pfVar33[4];
                      fVar184 = auVar147._4_4_ * pfVar33[5];
                      fVar145 = auVar147._8_4_ * pfVar33[6];
                      in_ZMM4 = ZEXT2864(CONCAT424(fVar145,CONCAT420(fVar184,CONCAT416(fVar183,
                                                  CONCAT412(fVar182,CONCAT48(fVar181,CONCAT44(
                                                  fVar180,fVar179)))))));
                      fVar78 = fVar179 + fVar78;
                      fVar79 = fVar180 + fVar79;
                      fVar80 = fVar181 + fVar80;
                      fVar81 = fVar182 + fVar81;
                      fVar82 = fVar183 + fVar82;
                      fVar83 = fVar184 + fVar83;
                      fVar177 = fVar145 + fVar177;
                      fVar178 = fVar178 + 0.0;
                      fVar169 = auVar116._0_4_ * pfVar33[8] + fVar169;
                      fVar170 = auVar116._4_4_ * pfVar33[9] + fVar170;
                      fVar171 = auVar116._8_4_ * pfVar33[10] + fVar171;
                      fVar172 = auVar116._12_4_ * pfVar33[0xb] + fVar172;
                      fVar173 = auVar147._0_4_ * pfVar33[0xc] + fVar173;
                      fVar174 = auVar147._4_4_ * pfVar33[0xd] + fVar174;
                      fVar62 = auVar147._8_4_ * pfVar33[0xe] + fVar62;
                      fVar77 = auVar147._12_4_ + fVar77;
                      pfVar33 = pfVar33 + 0x10;
                      pfVar42 = pfVar42 + lVar26;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  iVar38 = iVar39 + 0xf;
                  iVar39 = iVar39 + 8;
                } while (iVar38 < iVar53);
                uVar34 = (uint)local_90;
              }
              auVar116 = ZEXT816(0) << 0x40;
              auVar146 = ZEXT1664(auVar116);
              if ((int)(uVar34 | 3) < iVar53) {
                pvVar41 = (void *)((long)(_func_int ***)pvVar10 + (long)pvVar41);
                auVar163 = ZEXT1664((undefined1  [16])0x0);
                uVar57 = uVar34;
                do {
                  lVar36 = ((int)uVar57 / iVar4) * lVar35;
                  pfVar42 = (float *)((long)(_func_int ***)pvVar10 +
                                     lVar36 + (long)(iVar24 * (int)local_1b8) * 4);
                  if ((iVar4 == 4) && (0 < iVar5)) {
                    pfVar42 = (float *)(lVar36 + (long)pvVar41);
                    iVar39 = iVar5;
                    do {
                      auVar146 = ZEXT1664(CONCAT412(pfVar42[3] * pfVar33[3] + auVar146._12_4_,
                                                    CONCAT48(pfVar42[2] * pfVar33[2] +
                                                             auVar146._8_4_,
                                                             CONCAT44(pfVar42[1] * pfVar33[1] +
                                                                      auVar146._4_4_,
                                                                      *pfVar42 * *pfVar33 +
                                                                      auVar146._0_4_))));
                      auVar163 = ZEXT1664(CONCAT412(pfVar42[3] * pfVar33[7] + auVar163._12_4_,
                                                    CONCAT48(pfVar42[2] * pfVar33[6] +
                                                             auVar163._8_4_,
                                                             CONCAT44(pfVar42[1] * pfVar33[5] +
                                                                      auVar163._4_4_,
                                                                      *pfVar42 * pfVar33[4] +
                                                                      auVar163._0_4_))));
                      pfVar33 = pfVar33 + 8;
                      pfVar42 = pfVar42 + iVar6 * 4;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  iVar39 = iVar5;
                  if (0 < iVar5 && bVar59) {
                    do {
                      auVar116 = vinsertps_avx(ZEXT416((uint)*pfVar42),
                                               ZEXT416((uint)pfVar42[lVar56]),0x10);
                      auVar116 = vinsertps_avx(auVar116,ZEXT416((uint)pfVar42[iVar22 * 2]),0x20);
                      auVar116 = vinsertps_avx(auVar116,ZEXT416((uint)pfVar42[iVar22 * 3]),0x30);
                      auVar146 = ZEXT1664(CONCAT412(auVar116._12_4_ * pfVar33[3] + auVar146._12_4_,
                                                    CONCAT48(auVar116._8_4_ * pfVar33[2] +
                                                             auVar146._8_4_,
                                                             CONCAT44(auVar116._4_4_ * pfVar33[1] +
                                                                      auVar146._4_4_,
                                                                      auVar116._0_4_ * *pfVar33 +
                                                                      auVar146._0_4_))));
                      auVar163 = ZEXT1664(CONCAT412(auVar116._12_4_ * pfVar33[7] + auVar163._12_4_,
                                                    CONCAT48(auVar116._8_4_ * pfVar33[6] +
                                                             auVar163._8_4_,
                                                             CONCAT44(auVar116._4_4_ * pfVar33[5] +
                                                                      auVar163._4_4_,
                                                                      auVar116._0_4_ * pfVar33[4] +
                                                                      auVar163._0_4_))));
                      pfVar33 = pfVar33 + 8;
                      pfVar42 = pfVar42 + lVar26;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar147 = auVar163._0_16_;
                  auVar116 = auVar146._0_16_;
                  uVar34 = uVar57 + 4;
                  iVar39 = uVar57 + 7;
                  uVar57 = uVar34;
                } while (iVar39 < iVar53);
              }
              else {
                auVar147 = (undefined1  [16])0x0;
              }
              local_e8._0_8_ = pvVar41;
              uVar29 = (ulong)uVar34;
              auVar96._0_4_ = fVar82 + fVar78;
              auVar96._4_4_ = fVar83 + fVar79;
              auVar96._8_4_ = fVar177 + fVar80;
              auVar96._12_4_ = fVar178 + fVar81;
              auVar141 = vshufpd_avx(auVar96,auVar96,1);
              auVar97._0_4_ = auVar141._0_4_ + auVar96._0_4_;
              auVar97._4_4_ = auVar141._4_4_ + auVar96._4_4_;
              auVar97._8_4_ = auVar141._8_4_ + auVar96._8_4_;
              auVar97._12_4_ = auVar141._12_4_ + auVar96._12_4_;
              auVar67._0_4_ = fVar173 + fVar169;
              auVar67._4_4_ = fVar174 + fVar170;
              auVar67._8_4_ = fVar62 + fVar171;
              auVar67._12_4_ = fVar77 + fVar172;
              auVar141 = vshufpd_avx(auVar67,auVar67,1);
              auVar68._0_4_ = auVar141._0_4_ + auVar67._0_4_;
              auVar68._4_4_ = auVar141._4_4_ + auVar67._4_4_;
              auVar68._8_4_ = auVar141._8_4_ + auVar67._8_4_;
              auVar68._12_4_ = auVar141._12_4_ + auVar67._12_4_;
              auVar141 = vshufpd_avx(auVar116,auVar116,1);
              auVar144._0_4_ = auVar141._0_4_ + auVar116._0_4_;
              auVar144._4_4_ = auVar141._4_4_ + auVar116._4_4_;
              auVar144._8_4_ = auVar141._8_4_ + auVar116._8_4_;
              auVar144._12_4_ = auVar141._12_4_ + auVar116._12_4_;
              auVar116 = vinsertps_avx(auVar68,auVar97,0x4c);
              auVar141 = vshufpd_avx(auVar147,auVar147,1);
              auVar125._0_4_ = auVar141._0_4_ + auVar147._0_4_;
              auVar125._4_4_ = auVar141._4_4_ + auVar147._4_4_;
              auVar125._8_4_ = auVar141._8_4_ + auVar147._8_4_;
              auVar125._12_4_ = auVar141._12_4_ + auVar147._12_4_;
              auVar147 = vinsertps_avx(auVar97,auVar68,0x1c);
              auVar141 = vinsertps_avx(auVar125,auVar144,0x4c);
              auVar151 = vinsertps_avx(auVar144,auVar125,0x1c);
              auVar146 = ZEXT1664(CONCAT412(auVar116._12_4_ + 0.0 +
                                            auVar147._12_4_ + auVar141._12_4_ + auVar151._12_4_,
                                            CONCAT48(auVar116._8_4_ + 0.0 +
                                                     auVar147._8_4_ + auVar141._8_4_ +
                                                     auVar151._8_4_,
                                                     CONCAT44(auVar116._4_4_ + fVar168 +
                                                              auVar147._4_4_ + auVar141._4_4_ +
                                                              auVar151._4_4_,
                                                              auVar116._0_4_ + fVar166 +
                                                              auVar147._0_4_ + auVar141._0_4_ +
                                                              auVar151._0_4_))));
              if ((int)(uVar34 | 1) < iVar53) {
                lVar36 = local_120 + lVar35 * uVar29;
                ppp_Var37 = (_func_int ***)((long)&local_158->_vptr_Allocator + lVar35 * uVar29);
                do {
                  if (0 < iVar5) {
                    lVar58 = 0;
                    iVar39 = iVar5;
                    do {
                      fVar166 = *(float *)((long)ppp_Var37 + lVar58);
                      fVar168 = *(float *)(lVar36 + lVar58);
                      auVar146 = ZEXT1664(CONCAT412(fVar166 * 0.0 + auVar146._12_4_ + fVar168 * 0.0,
                                                    CONCAT48(fVar166 * 0.0 + auVar146._8_4_ +
                                                             fVar168 * 0.0,
                                                             CONCAT44((float)((ulong)*(undefined8 *)
                                                                                      pfVar33 >>
                                                                             0x20) * fVar166 +
                                                                      auVar146._4_4_ +
                                                                      (float)((ulong)*(undefined8 *)
                                                                                      (pfVar33 + 2)
                                                                             >> 0x20) * fVar168,
                                                                      (float)*(undefined8 *)pfVar33
                                                                      * fVar166 + auVar146._0_4_ +
                                                                      (float)*(undefined8 *)
                                                                              (pfVar33 + 2) *
                                                                      fVar168))));
                      pfVar33 = pfVar33 + 4;
                      lVar58 = lVar58 + lVar26 * 4;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar29 = uVar29 + 2;
                  uVar34 = (uint)uVar29;
                  lVar36 = lVar36 + lVar35 * 2;
                  ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar35 * 2);
                } while ((int)(uVar34 | 1) < iVar53);
              }
              auVar116 = auVar146._0_16_;
              if ((int)uVar34 < iVar53) {
                uVar29 = (ulong)uVar34;
                ppp_Var37 = (_func_int ***)((long)&local_158->_vptr_Allocator + lVar35 * uVar29);
                do {
                  ppp_Var44 = ppp_Var37;
                  iVar39 = iVar5;
                  if (0 < iVar5) {
                    do {
                      fVar166 = *(float *)ppp_Var44;
                      auVar146 = ZEXT1664(CONCAT412(fVar166 * 0.0 + auVar146._12_4_,
                                                    CONCAT48(fVar166 * 0.0 + auVar146._8_4_,
                                                             CONCAT44((float)((ulong)*(undefined8 *)
                                                                                      pfVar33 >>
                                                                             0x20) * fVar166 +
                                                                      auVar146._4_4_,
                                                                      (float)*(undefined8 *)pfVar33
                                                                      * fVar166 + auVar146._0_4_))))
                      ;
                      pfVar33 = pfVar33 + 2;
                      ppp_Var44 = (_func_int ***)((long)ppp_Var44 + lVar26 * 4);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar116 = auVar146._0_16_;
                  uVar29 = uVar29 + 1;
                  ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar35);
                } while ((int)uVar29 < iVar53);
              }
              iVar39 = (int)local_80 + -1;
              fVar168 = auVar116._0_4_;
              fVar166 = fVar168;
              switch(iVar39) {
              case 0:
                auVar147 = vmaxss_avx(auVar116,ZEXT416(0));
                fVar166 = auVar147._0_4_;
                break;
              case 1:
                auVar147 = vcmpss_avx(ZEXT816(0) << 0x40,auVar116,1);
                auVar99._8_4_ = 0x3f800000;
                auVar99._0_8_ = 0x3f8000003f800000;
                auVar99._12_4_ = 0x3f800000;
                auVar147 = vblendvps_avx(ZEXT416((uint)*pfVar32),auVar99,auVar147);
                fVar166 = auVar147._0_4_;
                goto LAB_00541489;
              case 2:
                auVar147 = vmaxss_avx(auVar116,ZEXT416((uint)*pfVar32));
                fVar166 = auVar147._0_4_;
                if (pfVar32[1] < auVar147._0_4_) {
                  fVar166 = pfVar32[1];
                }
                break;
              case 3:
                auVar147 = vminss_avx(auVar116,ZEXT416(0x42b0c0a5));
                auVar69._0_8_ = auVar147._0_8_ ^ 0x8000000080000000;
                auVar69._8_4_ = auVar147._8_4_ ^ 0x80000000;
                auVar69._12_4_ = auVar147._12_4_ ^ 0x80000000;
                auVar147 = vcmpss_avx(auVar147,ZEXT416(0xc2b0c0a5),1);
                auVar98._8_4_ = 0x42b0c0a5;
                auVar98._0_8_ = 0x42b0c0a542b0c0a5;
                auVar98._12_4_ = 0x42b0c0a5;
                auVar147 = vblendvps_avx(auVar69,auVar98,auVar147);
                fVar166 = expf(auVar147._0_4_);
                fVar166 = 1.0 / (fVar166 + 1.0);
                break;
              case 4:
                fVar166 = expf(fVar168);
                fVar166 = logf(fVar166 + 1.0);
                fVar166 = tanhf(fVar166);
LAB_00541489:
                fVar166 = fVar166 * fVar168;
                break;
              case 5:
                fVar169 = *pfVar32;
                fVar170 = -pfVar32[1] / fVar169;
                fVar166 = 0.0;
                if ((fVar170 <= fVar168) && (fVar166 = fVar168, fVar168 <= fVar170 + 1.0 / fVar169))
                {
                  fVar166 = fVar169 * fVar168 + pfVar32[1];
                  goto LAB_00541489;
                }
              }
              auVar116 = vmovshdup_avx(auVar116);
              in_ZMM4 = ZEXT1664(auVar116);
              fVar169 = auVar116._0_4_;
              fVar168 = fVar169;
              switch(iVar39) {
              case 0:
                auVar116 = vmaxss_avx(auVar116,ZEXT416(0));
                fVar168 = auVar116._0_4_;
                break;
              case 1:
                auVar116 = vcmpss_avx(ZEXT816(0) << 0x40,auVar116,1);
                auVar101._8_4_ = 0x3f800000;
                auVar101._0_8_ = 0x3f8000003f800000;
                auVar101._12_4_ = 0x3f800000;
                auVar116 = vblendvps_avx(ZEXT416((uint)*pfVar32),auVar101,auVar116);
                fVar168 = auVar116._0_4_ * fVar169;
                break;
              case 2:
                auVar116 = vmaxss_avx(auVar116,ZEXT416((uint)*pfVar32));
                fVar168 = auVar116._0_4_;
                if (pfVar32[1] < auVar116._0_4_) {
                  fVar168 = pfVar32[1];
                }
                break;
              case 3:
                auVar147 = vminss_avx(auVar116,ZEXT416(0x42b0c0a5));
                auVar70._0_8_ = auVar147._0_8_ ^ 0x8000000080000000;
                auVar70._8_4_ = auVar147._8_4_ ^ 0x80000000;
                auVar70._12_4_ = auVar147._12_4_ ^ 0x80000000;
                auVar147 = vcmpss_avx(auVar147,ZEXT416(0xc2b0c0a5),1);
                auVar100._8_4_ = 0x42b0c0a5;
                auVar100._0_8_ = 0x42b0c0a542b0c0a5;
                auVar100._12_4_ = 0x42b0c0a5;
                auVar147 = vblendvps_avx(auVar70,auVar100,auVar147);
                in_ZMM4 = ZEXT1664(auVar116);
                fVar168 = expf(auVar147._0_4_);
                fVar168 = 1.0 / (fVar168 + 1.0);
                break;
              case 4:
                in_ZMM4 = ZEXT1664(auVar116);
                fVar168 = expf(fVar169);
                fVar168 = logf(fVar168 + 1.0);
                fVar168 = tanhf(fVar168);
                local_e8 = auVar116;
                fVar168 = fVar168 * fVar169;
                break;
              case 5:
                fVar170 = *pfVar32;
                fVar171 = -pfVar32[1] / fVar170;
                fVar168 = 0.0;
                if ((fVar171 <= fVar169) && (fVar168 = fVar169, fVar169 <= fVar171 + 1.0 / fVar170))
                {
                  fVar168 = (fVar170 * fVar169 + pfVar32[1]) * fVar169;
                }
              }
              *pfVar51 = fVar166;
              *pfVar47 = fVar168;
              pfVar51 = pfVar51 + 1;
              pfVar47 = pfVar47 + 1;
              local_1b8 = local_1b8 + 1;
              iVar49 = iVar49 + iVar25;
              local_120 = local_120 + lVar27 * 4;
              local_158 = (Allocator *)((long)&local_158->_vptr_Allocator + lVar27 * 4);
            } while (local_1b8 != uVar48);
          }
          local_140 = local_140 + 1;
        } while (local_140 != local_78);
      }
      iVar24 = (int)local_68 + (int)local_70 * 2;
      if (iVar24 < (int)local_88) {
        pvVar10 = top_blob->data;
        iVar25 = top_blob->w;
        sVar11 = top_blob->elemsize;
        sVar12 = (this->weight_data_tm).elemsize;
        sVar13 = (this->weight_data_tm).cstep;
        bVar59 = 0 < iVar5;
        local_128 = uVar21 & 0xfffffff8;
        local_1a0 = (ulong)iVar24;
        pvVar41 = (this->weight_data_tm).data;
        do {
          pvVar20 = local_d8.data;
          if (0 < (int)local_60) {
            pfVar47 = (float *)((long)iVar25 * sVar11 * local_1a0 + (long)pvVar10);
            uVar34 = (uint)local_1a0;
            uVar57 = uVar34 + 3;
            uVar48 = uVar34 + 7;
            if (-1 < (int)uVar34) {
              uVar57 = uVar34;
              uVar48 = uVar34;
            }
            iVar53 = uVar34 - (uVar48 & 0xfffffff8);
            iVar24 = (uVar34 - (uVar48 & 0xfffffff8)) + 3;
            if (-1 < iVar53) {
              iVar24 = iVar53;
            }
            pfVar32 = (float *)((long)(int)((uVar34 - (((uint)(local_1a0 >> 0x1f) & 1) + uVar34 &
                                                      0xfffffffe)) + ((int)uVar48 >> 3) +
                                            (int)(uVar34 - (uVar57 & 0xfffffffc)) / 2 +
                                           (iVar24 >> 2)) * sVar12 * sVar13 + (long)pvVar41);
            lVar54 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
            pfVar51 = *(float **)(&this->field_0xf8 + (long)p_Var8);
            local_1b0 = (void *)((long)(_func_int ***)local_d8.data + lVar56 * 4);
            iVar24 = 0;
            local_198 = (Allocator *)local_d8.data;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_e8._8_8_;
            local_e8 = auVar19 << 0x40;
            do {
              if (lVar9 == 0) {
                fVar166 = 0.0;
              }
              else {
                fVar166 = *(float *)(lVar9 + local_1a0 * 4);
              }
              pfVar31 = pfVar32;
              if ((int)uVar21 < 8) {
                fVar168 = 0.0;
                fVar169 = 0.0;
                fVar170 = 0.0;
                fVar171 = 0.0;
                fVar172 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar62 = 0.0;
                uVar34 = 0;
              }
              else {
                fVar168 = 0.0;
                fVar169 = 0.0;
                fVar170 = 0.0;
                fVar171 = 0.0;
                fVar172 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar62 = 0.0;
                iVar53 = 0;
                do {
                  lVar28 = (iVar53 / iVar4) * lVar54;
                  if (iVar4 == 8 && bVar59) {
                    pfVar33 = (float *)((long)(_func_int ***)pvVar20 + lVar28 + (long)iVar24 * 4);
                    iVar49 = iVar5;
                    do {
                      fVar168 = *pfVar31 * *pfVar33 + fVar168;
                      fVar169 = pfVar31[1] * pfVar33[1] + fVar169;
                      fVar170 = pfVar31[2] * pfVar33[2] + fVar170;
                      fVar171 = pfVar31[3] * pfVar33[3] + fVar171;
                      fVar172 = pfVar31[4] * pfVar33[4] + fVar172;
                      fVar173 = pfVar31[5] * pfVar33[5] + fVar173;
                      fVar174 = pfVar31[6] * pfVar33[6] + fVar174;
                      fVar62 = pfVar31[7] + fVar62;
                      pfVar31 = pfVar31 + 8;
                      pfVar33 = pfVar33 + iVar6 * 8;
                      iVar49 = iVar49 + -1;
                    } while (iVar49 != 0);
                  }
                  else {
                    pfVar33 = (float *)((long)(_func_int ***)pvVar20 +
                                       lVar28 + (long)(iVar4 * iVar45 * local_e8._0_4_) * 4);
                  }
                  iVar49 = iVar5;
                  if (iVar4 == 4 && bVar59) {
                    do {
                      fVar168 = *pfVar33 * *pfVar31 + fVar168;
                      fVar169 = pfVar33[1] * pfVar31[1] + fVar169;
                      fVar170 = pfVar33[2] * pfVar31[2] + fVar170;
                      fVar171 = pfVar33[3] * pfVar31[3] + fVar171;
                      fVar172 = pfVar33[lVar56 + 4] * pfVar31[4] + fVar172;
                      fVar173 = pfVar33[lVar56 + 5] * pfVar31[5] + fVar173;
                      fVar174 = pfVar33[lVar56 + 6] * pfVar31[6] + fVar174;
                      fVar62 = pfVar33[lVar56 + 7] + fVar62;
                      pfVar31 = pfVar31 + 8;
                      pfVar33 = pfVar33 + iVar6 * 4;
                      iVar49 = iVar49 + -1;
                    } while (iVar49 != 0);
                  }
                  iVar49 = iVar5;
                  if (iVar4 == 1 && bVar59) {
                    do {
                      auVar116 = vinsertps_avx(ZEXT416((uint)*pfVar33),
                                               ZEXT416((uint)pfVar33[lVar56]),0x10);
                      auVar116 = vinsertps_avx(auVar116,ZEXT416((uint)pfVar33[iVar22 * 2]),0x20);
                      auVar116 = vinsertps_avx(auVar116,ZEXT416((uint)pfVar33[iVar22 * 3]),0x30);
                      auVar147 = vinsertps_avx(ZEXT416((uint)pfVar33[iVar22 * 4]),
                                               ZEXT416((uint)pfVar33[iVar22 * 5]),0x10);
                      auVar147 = vinsertps_avx(auVar147,ZEXT416((uint)pfVar33[iVar22 * 6]),0x20);
                      auVar147 = vinsertps_avx(auVar147,ZEXT416((uint)pfVar33[iVar22 * 7]),0x30);
                      fVar168 = auVar116._0_4_ * *pfVar31 + fVar168;
                      fVar169 = auVar116._4_4_ * pfVar31[1] + fVar169;
                      fVar170 = auVar116._8_4_ * pfVar31[2] + fVar170;
                      fVar171 = auVar116._12_4_ * pfVar31[3] + fVar171;
                      fVar172 = auVar147._0_4_ * pfVar31[4] + fVar172;
                      fVar173 = auVar147._4_4_ * pfVar31[5] + fVar173;
                      fVar174 = auVar147._8_4_ * pfVar31[6] + fVar174;
                      fVar62 = auVar147._12_4_ + fVar62;
                      pfVar31 = pfVar31 + 8;
                      pfVar33 = pfVar33 + lVar26;
                      iVar49 = iVar49 + -1;
                    } while (iVar49 != 0);
                  }
                  iVar49 = iVar53 + 0xf;
                  iVar53 = iVar53 + 8;
                  uVar34 = local_128;
                } while (iVar49 < (int)uVar21);
              }
              auVar116 = ZEXT816(0) << 0x40;
              auVar146 = ZEXT1664(auVar116);
              if ((int)(uVar34 | 3) < (int)uVar21) {
                uVar48 = uVar34;
                do {
                  lVar28 = ((int)uVar48 / iVar4) * lVar54;
                  if (iVar4 == 4 && bVar59) {
                    pfVar33 = (float *)((long)(_func_int ***)pvVar20 + lVar28 + (long)iVar24 * 4);
                    iVar53 = iVar5;
                    do {
                      auVar146 = ZEXT1664(CONCAT412(pfVar31[3] * pfVar33[3] + auVar146._12_4_,
                                                    CONCAT48(pfVar31[2] * pfVar33[2] +
                                                             auVar146._8_4_,
                                                             CONCAT44(pfVar31[1] * pfVar33[1] +
                                                                      auVar146._4_4_,
                                                                      *pfVar31 * *pfVar33 +
                                                                      auVar146._0_4_))));
                      pfVar31 = pfVar31 + 4;
                      pfVar33 = pfVar33 + iVar6 * 4;
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  else {
                    pfVar33 = (float *)((long)(_func_int ***)pvVar20 +
                                       lVar28 + (long)(iVar4 * iVar45 * local_e8._0_4_) * 4);
                  }
                  iVar53 = iVar5;
                  if (iVar4 == 1 && bVar59) {
                    do {
                      auVar116 = vinsertps_avx(ZEXT416((uint)*pfVar33),
                                               ZEXT416((uint)pfVar33[lVar56]),0x10);
                      auVar116 = vinsertps_avx(auVar116,ZEXT416((uint)pfVar33[iVar22 * 2]),0x20);
                      auVar116 = vinsertps_avx(auVar116,ZEXT416((uint)pfVar33[iVar22 * 3]),0x30);
                      auVar146 = ZEXT1664(CONCAT412(auVar116._12_4_ * pfVar31[3] + auVar146._12_4_,
                                                    CONCAT48(auVar116._8_4_ * pfVar31[2] +
                                                             auVar146._8_4_,
                                                             CONCAT44(auVar116._4_4_ * pfVar31[1] +
                                                                      auVar146._4_4_,
                                                                      auVar116._0_4_ * *pfVar31 +
                                                                      auVar146._0_4_))));
                      pfVar31 = pfVar31 + 4;
                      pfVar33 = pfVar33 + lVar26;
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  auVar116 = auVar146._0_16_;
                  uVar34 = uVar48 + 4;
                  iVar53 = uVar48 + 7;
                  uVar48 = uVar34;
                } while (iVar53 < (int)uVar21);
              }
              uVar29 = (ulong)uVar34;
              auVar71._0_4_ = fVar172 + fVar168;
              auVar71._4_4_ = fVar173 + fVar169;
              auVar71._8_4_ = fVar174 + fVar170;
              auVar71._12_4_ = fVar62 + fVar171;
              auVar147 = vshufpd_avx(auVar71,auVar71,1);
              auVar72._0_4_ = auVar147._0_4_ + auVar71._0_4_;
              auVar72._4_4_ = auVar147._4_4_ + auVar71._4_4_;
              auVar72._8_4_ = auVar147._8_4_ + auVar71._8_4_;
              auVar72._12_4_ = auVar147._12_4_ + auVar71._12_4_;
              auVar147 = vmovshdup_avx(auVar72);
              auVar141 = vshufpd_avx(auVar116,auVar116,1);
              auVar102._0_4_ = auVar141._0_4_ + auVar116._0_4_;
              auVar102._4_4_ = auVar141._4_4_ + auVar116._4_4_;
              auVar102._8_4_ = auVar141._8_4_ + auVar116._8_4_;
              auVar102._12_4_ = auVar141._12_4_ + auVar116._12_4_;
              auVar116 = vmovshdup_avx(auVar102);
              auVar146 = ZEXT464((uint)(auVar147._0_4_ + fVar166 +
                                       auVar72._0_4_ + auVar116._0_4_ + auVar102._0_4_));
              if ((int)(uVar34 | 1) < (int)uVar21) {
                pvVar43 = (void *)((long)local_1b0 + lVar54 * uVar29);
                ppp_Var37 = (_func_int ***)((long)&local_198->_vptr_Allocator + lVar54 * uVar29);
                do {
                  if (0 < iVar5) {
                    lVar28 = 0;
                    iVar53 = iVar5;
                    do {
                      auVar146 = ZEXT464((uint)(*pfVar31 * *(float *)((long)ppp_Var37 + lVar28) +
                                                auVar146._0_4_ +
                                               pfVar31[1] * *(float *)((long)pvVar43 + lVar28)));
                      pfVar31 = pfVar31 + 2;
                      lVar28 = lVar28 + lVar26 * 4;
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  uVar29 = uVar29 + 2;
                  uVar34 = (uint)uVar29;
                  pvVar43 = (void *)((long)pvVar43 + lVar54 * 2);
                  ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar54 * 2);
                } while ((int)(uVar34 | 1) < (int)uVar21);
              }
              auVar116 = auVar146._0_16_;
              if ((int)uVar34 < (int)uVar21) {
                uVar29 = (ulong)uVar34;
                ppp_Var37 = (_func_int ***)((long)&local_198->_vptr_Allocator + lVar54 * uVar29);
                do {
                  ppp_Var44 = ppp_Var37;
                  iVar53 = iVar5;
                  if (0 < iVar5) {
                    do {
                      auVar146 = ZEXT464((uint)(*pfVar31 * *(float *)ppp_Var44 + auVar146._0_4_));
                      pfVar31 = pfVar31 + 1;
                      ppp_Var44 = (_func_int ***)((long)ppp_Var44 + lVar26 * 4);
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  auVar116 = auVar146._0_16_;
                  uVar29 = uVar29 + 1;
                  ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar54);
                } while ((int)uVar29 < (int)uVar21);
              }
              fVar168 = auVar116._0_4_;
              fVar166 = fVar168;
              switch((int)local_80) {
              case 1:
                auVar116 = vmaxss_avx(auVar116,ZEXT416(0));
                fVar166 = auVar116._0_4_;
                break;
              case 2:
                auVar116 = vcmpss_avx(ZEXT416(0) << 0x20,auVar116,1);
                auVar104._8_4_ = 0x3f800000;
                auVar104._0_8_ = 0x3f8000003f800000;
                auVar104._12_4_ = 0x3f800000;
                auVar116 = vblendvps_avx(ZEXT416((uint)*pfVar51),auVar104,auVar116);
                fVar166 = auVar116._0_4_ * fVar168;
                break;
              case 3:
                auVar116 = vmaxss_avx(auVar116,ZEXT416((uint)*pfVar51));
                fVar166 = auVar116._0_4_;
                if (pfVar51[1] < auVar116._0_4_) {
                  fVar166 = pfVar51[1];
                }
                break;
              case 4:
                auVar116 = vminss_avx(auVar116,ZEXT416(0x42b0c0a5));
                auVar73._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
                auVar73._8_4_ = auVar116._8_4_ ^ 0x80000000;
                auVar73._12_4_ = auVar116._12_4_ ^ 0x80000000;
                auVar116 = vcmpss_avx(auVar116,ZEXT416(0xc2b0c0a5),1);
                auVar103._8_4_ = 0x42b0c0a5;
                auVar103._0_8_ = 0x42b0c0a542b0c0a5;
                auVar103._12_4_ = 0x42b0c0a5;
                auVar116 = vblendvps_avx(auVar73,auVar103,auVar116);
                fVar166 = expf(auVar116._0_4_);
                fVar166 = 1.0 / (fVar166 + 1.0);
                break;
              case 5:
                fVar166 = expf(fVar168);
                fVar166 = logf(fVar166 + 1.0);
                fVar166 = tanhf(fVar166);
                fVar166 = fVar166 * fVar168;
                break;
              case 6:
                fVar169 = *pfVar51;
                fVar170 = -pfVar51[1] / fVar169;
                fVar166 = 0.0;
                if ((fVar170 <= fVar168) && (fVar166 = fVar168, fVar168 <= fVar170 + 1.0 / fVar169))
                {
                  fVar166 = (fVar169 * fVar168 + pfVar51[1]) * fVar168;
                }
              }
              *pfVar47 = fVar166;
              pfVar47 = pfVar47 + 1;
              lVar28 = local_e8._0_8_ + 1;
              iVar24 = iVar24 + iVar45 * iVar4;
              local_1b0 = (void *)((long)local_1b0 + lVar27 * 4);
              local_198 = (Allocator *)((long)&local_198->_vptr_Allocator + lVar27 * 4);
              local_e8._0_8_ = lVar28;
            } while (lVar28 != local_60);
          }
          local_1a0 = local_1a0 + 1;
        } while (local_1a0 != local_88);
      }
      iVar45 = 0;
    }
  }
  piVar18 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_d8.data != (Allocator *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar45;
}

Assistant:

int Convolution1D_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}